

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  _func_int *p_Var6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  int iVar134;
  uint uVar135;
  ulong uVar136;
  undefined1 (*pauVar137) [32];
  long lVar138;
  long lVar139;
  long lVar140;
  int iVar141;
  long lVar142;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar176 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 (*pauVar143) [16];
  undefined1 (*pauVar144) [16];
  long lVar145;
  undefined1 (*pauVar146) [32];
  long lVar147;
  undefined1 (*pauVar148) [16];
  int iVar149;
  long lVar150;
  undefined1 (*pauVar151) [16];
  long lVar152;
  ulong uVar153;
  long lVar154;
  long lVar155;
  unsigned_short *puVar156;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar157 [16];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  float fVar223;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar230 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar251;
  __m128 pos;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar270;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  v4sf one;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  __m128 pos_1;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar334 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar335 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar336 [64];
  undefined1 (*local_338) [32];
  int *piStack_330;
  size_t local_328;
  int local_320;
  Allocator *local_318;
  int local_310;
  int local_30c;
  undefined8 local_308;
  int local_300;
  size_t local_2f8;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  float local_278;
  undefined1 local_268 [16];
  float local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  ulong local_1d8;
  long local_1d0;
  ulong local_1c8;
  long local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_flatten;
  
  auVar157 = in_ZMM30._0_16_;
  local_310 = bottom_blob->dims;
  if (local_310 == 2) {
    local_30c = bottom_blob->w;
    if (local_30c ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                   (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var6),
                 *(int *)(&this->field_0xe0 + (long)p_Var6),
                 (Mat *)(&this->field_0xe8 + (long)p_Var6),opt);
      return 0;
    }
  }
  else {
    local_30c = bottom_blob->w;
  }
  piVar7 = bottom_blob->refcount;
  local_338 = (undefined1 (*) [32])bottom_blob->data;
  piStack_330 = bottom_blob->refcount;
  local_328 = bottom_blob->elemsize;
  local_320 = bottom_blob->elempack;
  local_318 = bottom_blob->allocator;
  local_308._0_4_ = bottom_blob->h;
  local_308._4_4_ = bottom_blob->d;
  local_300 = bottom_blob->c;
  local_2f8 = bottom_blob->cstep;
  iVar134 = local_310;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    iVar134 = bottom_blob->dims;
  }
  if (iVar134 != 1) {
    opt_flatten._16_48_ = SUB6448(*opt,0x10);
    opt_flatten._0_8_ = SUB648(*opt,0);
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_338);
  }
  uVar5 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  if (opt->use_packing_layout == true) {
    if ((uVar5 & 0xf) == 0) {
      uVar135 = 0x10;
    }
    else if ((uVar5 & 7) == 0) {
      uVar135 = 8;
    }
    else {
      uVar135 = (uint)((uVar5 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar135 = 1;
  }
  Mat::create(top_blob,(int)uVar5 / (int)uVar135,
              (ulong)uVar135 * (local_328 / (ulong)(long)local_320),uVar135,opt->blob_allocator);
  afVar133 = _ps512_cephes_log_q1;
  afVar132 = _ps512_cephes_exp_p5;
  afVar131 = _ps512_cephes_exp_p4;
  afVar130 = _ps512_cephes_exp_p3;
  afVar129 = _ps512_cephes_exp_p2;
  afVar128 = _ps512_cephes_exp_p1;
  afVar127 = _ps512_cephes_exp_p0;
  afVar126 = _ps512_cephes_LOG2EF;
  afVar125 = _ps512_exp_lo;
  afVar124 = _ps512_exp_hi;
  afVar123 = _ps512_1;
  iVar134 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
    iVar134 = *(int *)(&this->field_0xe0 + (long)p_Var6);
    iVar141 = local_320 * local_30c;
    iVar149 = top_blob->elempack;
    uVar5 = top_blob->w;
    uVar153 = (ulong)uVar5;
    lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
    if (iVar149 == 1) {
      uVar153 = 0;
      local_1d8 = (ulong)(uint)((int)uVar5 >> 3);
      if ((int)uVar5 >> 3 < 1) {
        local_1d8 = uVar153;
      }
      lVar138 = 1;
      lVar142 = 2;
      lVar145 = 3;
      lVar147 = 4;
      lVar150 = 5;
      lVar152 = 6;
      lVar140 = 7;
      uVar136 = 0;
      while (pauVar146 = local_338, uVar136 != local_1d8) {
        local_1d0 = uVar136 * 8;
        auVar157 = ZEXT816(0) << 0x40;
        auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar207 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar136 * 0x20));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar154 = (long)(this->weight_data_tm).w;
        local_238._0_8_ = lVar154;
        lVar139 = 0;
        lVar155 = 0;
        auVar161 = ZEXT816(0) << 0x40;
        auVar160 = ZEXT816(0) << 0x40;
        auVar159 = ZEXT816(0) << 0x40;
        auVar158 = ZEXT816(0) << 0x40;
        auVar176 = ZEXT816(0) << 0x40;
        local_1f8._0_16_ = ZEXT816(0);
        local_218._0_16_ = ZEXT816(0);
        local_218 = ZEXT1632(local_218._0_16_);
        iVar149 = 0;
        while( true ) {
          local_1f8 = ZEXT1632(local_1f8._0_16_);
          auVar213 = ZEXT1664(auVar176);
          auVar212 = ZEXT1664(auVar158);
          auVar211 = ZEXT1664(auVar159);
          auVar210 = ZEXT1664(auVar160);
          auVar209 = ZEXT1664(auVar161);
          auVar208 = ZEXT1664(auVar157);
          local_98 = ZEXT1632(auVar176);
          local_1b8 = ZEXT1632(auVar158);
          local_138 = ZEXT1632(auVar159);
          local_198 = ZEXT1632(auVar160);
          local_178 = ZEXT1632(auVar161);
          local_158 = ZEXT1632(auVar157);
          if (iVar141 <= iVar149 + 7) break;
          auVar183 = *(undefined1 (*) [32])(*local_338 + lVar155 * 2);
          auVar157 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * uVar153 * lVar154));
          auVar176 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar138 * lVar154));
          auVar158 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar142 * lVar154));
          auVar159 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar145 * lVar154));
          auVar160 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar147 * lVar154));
          auVar161 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar150 * lVar154));
          auVar162 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar152 * lVar154));
          auVar163 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar9 + lVar155 + sVar10 * lVar140 * lVar154));
          auVar184 = vcvtph2ps_f16c(auVar157);
          auVar185 = vcvtph2ps_f16c(auVar176);
          auVar186 = vcvtph2ps_f16c(auVar158);
          auVar187 = vcvtph2ps_f16c(auVar159);
          auVar188 = vcvtph2ps_f16c(auVar160);
          auVar189 = vcvtph2ps_f16c(auVar161);
          auVar190 = vcvtph2ps_f16c(auVar162);
          local_218 = vfmadd231ps_avx512vl(local_218,auVar183,auVar184);
          local_1f8._0_16_ = vfmadd231ps_fma(local_1f8,auVar183,auVar185);
          auVar176 = vfmadd231ps_fma(local_98,auVar183,auVar186);
          auVar158 = vfmadd231ps_fma(local_1b8,auVar183,auVar187);
          auVar184 = vcvtph2ps_f16c(auVar163);
          auVar159 = vfmadd231ps_fma(local_138,auVar183,auVar188);
          auVar160 = vfmadd231ps_fma(local_198,auVar183,auVar189);
          auVar161 = vfmadd231ps_fma(local_178,auVar183,auVar190);
          auVar157 = vfmadd231ps_fma(local_158,auVar183,auVar184);
          iVar149 = iVar149 + 8;
          lVar155 = lVar155 + 0x10;
          lVar139 = lVar139 + 8;
        }
        lVar154 = sVar10 * lVar154;
        local_1c8 = uVar136;
        local_1c0 = lVar138;
        for (; (int)lVar139 < iVar141; lVar139 = lVar139 + 1) {
          local_238 = auVar207._0_32_;
          puVar156 = (unsigned_short *)((long)pvVar9 + lVar139 * 2 + lVar154 * uVar153);
          local_248 = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          local_258 = float16_to_float32(*puVar156);
          local_268 = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          uStack_254 = extraout_XMM0_Db;
          uStack_250 = extraout_XMM0_Dc;
          uStack_24c = extraout_XMM0_Dd;
          local_278 = float16_to_float32(*(unsigned_short *)((long)puVar156 + lVar154));
          local_288 = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          fVar251 = float16_to_float32(puVar156[lVar154]);
          auVar183 = local_b8;
          local_b8._4_4_ = extraout_XMM0_Db_00;
          local_b8._0_4_ = fVar251;
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._16_16_ = auVar183._16_16_;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          local_d8._0_16_ = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          fVar251 = float16_to_float32(*(unsigned_short *)((long)puVar156 + lVar154 * 3));
          auVar183 = local_f8;
          local_f8._4_4_ = extraout_XMM0_Db_01;
          local_f8._0_4_ = fVar251;
          local_f8._8_4_ = extraout_XMM0_Dc_01;
          local_f8._16_16_ = auVar183._16_16_;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          local_118._0_16_ = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          local_298._0_4_ = float16_to_float32(puVar156[lVar154 * 2]);
          local_298._4_4_ = extraout_XMM0_Db_02;
          local_298._8_4_ = extraout_XMM0_Dc_02;
          local_298._12_4_ = extraout_XMM0_Dd_02;
          local_2a8 = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          local_2b8._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar156 + lVar154 * 5));
          local_2b8._4_4_ = extraout_XMM0_Db_03;
          local_2b8._8_4_ = extraout_XMM0_Dc_03;
          local_2b8._12_4_ = extraout_XMM0_Dd_03;
          local_2c8 = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          fVar251 = float16_to_float32(puVar156[lVar154 * 3]);
          local_2d8 = CONCAT44(extraout_XMM0_Db_04,fVar251);
          local_2e8 = ZEXT416(*(uint *)(*pauVar146 + lVar139 * 4));
          auVar207._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar156 + lVar154 * 7));
          auVar207._4_60_ = extraout_var;
          auVar157 = vinsertps_avx(local_298,ZEXT416((uint)local_2b8._0_4_),0x10);
          auVar157 = vinsertps_avx(auVar157,ZEXT416((uint)local_2d8),0x20);
          auVar157 = vinsertps_avx(auVar157,auVar207._0_16_,0x30);
          auVar176._4_4_ = uStack_254;
          auVar176._0_4_ = local_258;
          auVar176._8_4_ = uStack_250;
          auVar176._12_4_ = uStack_24c;
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_278),0x10);
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_b8._0_4_),0x20);
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_f8._0_4_),0x30);
          auVar183._16_16_ = auVar157;
          auVar183._0_16_ = auVar176;
          auVar157 = vinsertps_avx(local_118._0_16_,ZEXT416((uint)local_2a8._0_4_),0x10);
          auVar157 = vinsertps_avx(auVar157,ZEXT416((uint)local_2c8._0_4_),0x20);
          auVar157 = vinsertps_avx(auVar157,ZEXT416((uint)local_2e8._0_4_),0x30);
          auVar176 = vinsertps_avx(local_248,ZEXT416((uint)local_268._0_4_),0x10);
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_288._0_4_),0x20);
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_d8._0_4_),0x30);
          auVar184._16_16_ = auVar157;
          auVar184._0_16_ = auVar176;
          auVar157 = vfmadd231ps_fma(local_238,auVar183,auVar184);
          auVar207 = ZEXT1664(auVar157);
          auVar208 = ZEXT3264(local_158);
          auVar209 = ZEXT3264(local_178);
          auVar210 = ZEXT3264(local_198);
          auVar211 = ZEXT3264(local_138);
          auVar212 = ZEXT3264(local_1b8);
          auVar213 = ZEXT3264(local_98);
        }
        auVar183 = vhaddps_avx(local_218,local_1f8);
        auVar184 = vhaddps_avx(auVar213._0_32_,auVar212._0_32_);
        auVar184 = vhaddps_avx(auVar183,auVar184);
        auVar183 = vhaddps_avx(auVar211._0_32_,auVar210._0_32_);
        auVar185 = vhaddps_avx(auVar209._0_32_,auVar208._0_32_);
        auVar185 = vhaddps_avx(auVar183,auVar185);
        auVar183 = vblendps_avx(auVar184,auVar185,0xf0);
        auVar184 = vperm2f128_avx(auVar184,auVar185,0x21);
        auVar186._0_4_ = auVar207._0_4_ + auVar184._0_4_ + auVar183._0_4_;
        auVar186._4_4_ = auVar207._4_4_ + auVar184._4_4_ + auVar183._4_4_;
        auVar186._8_4_ = auVar207._8_4_ + auVar184._8_4_ + auVar183._8_4_;
        auVar186._12_4_ = auVar207._12_4_ + auVar184._12_4_ + auVar183._12_4_;
        auVar186._16_4_ = auVar207._16_4_ + auVar184._16_4_ + auVar183._16_4_;
        auVar186._20_4_ = auVar207._20_4_ + auVar184._20_4_ + auVar183._20_4_;
        auVar186._24_4_ = auVar207._24_4_ + auVar184._24_4_ + auVar183._24_4_;
        auVar186._28_4_ = auVar207._28_4_ + auVar184._28_4_ + auVar183._28_4_;
        auVar185 = auVar186;
        if (iVar134 - 1U < 6) {
          auVar185 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
          switch(iVar134) {
          case 2:
            auVar183 = vminps_avx(auVar186,ZEXT832(0) << 0x20);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar107._4_4_ = uVar1;
            auVar107._0_4_ = uVar1;
            auVar107._8_4_ = uVar1;
            auVar107._12_4_ = uVar1;
            auVar107._16_4_ = uVar1;
            auVar107._20_4_ = uVar1;
            auVar107._24_4_ = uVar1;
            auVar107._28_4_ = uVar1;
            auVar185 = vfmadd231ps_avx512vl(auVar185,auVar183,auVar107);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar105._4_4_ = uVar1;
            auVar105._0_4_ = uVar1;
            auVar105._8_4_ = uVar1;
            auVar105._12_4_ = uVar1;
            auVar105._16_4_ = uVar1;
            auVar105._20_4_ = uVar1;
            auVar105._24_4_ = uVar1;
            auVar105._28_4_ = uVar1;
            auVar183 = vmaxps_avx512vl(auVar186,auVar105);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar106._4_4_ = uVar1;
            auVar106._0_4_ = uVar1;
            auVar106._8_4_ = uVar1;
            auVar106._12_4_ = uVar1;
            auVar106._16_4_ = uVar1;
            auVar106._20_4_ = uVar1;
            auVar106._24_4_ = uVar1;
            auVar106._28_4_ = uVar1;
            auVar185 = vminps_avx512vl(auVar183,auVar106);
            break;
          case 4:
            auVar94._8_4_ = 0x80000000;
            auVar94._0_8_ = 0x8000000080000000;
            auVar94._12_4_ = 0x80000000;
            auVar94._16_4_ = 0x80000000;
            auVar94._20_4_ = 0x80000000;
            auVar94._24_4_ = 0x80000000;
            auVar94._28_4_ = 0x80000000;
            auVar183 = vxorps_avx512vl(auVar186,auVar94);
            auVar95._8_4_ = 0x42b0c0a5;
            auVar95._0_8_ = 0x42b0c0a542b0c0a5;
            auVar95._12_4_ = 0x42b0c0a5;
            auVar95._16_4_ = 0x42b0c0a5;
            auVar95._20_4_ = 0x42b0c0a5;
            auVar95._24_4_ = 0x42b0c0a5;
            auVar95._28_4_ = 0x42b0c0a5;
            auVar183 = vminps_avx512vl(auVar183,auVar95);
            auVar96._8_4_ = 0xc2b0c0a5;
            auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar96._12_4_ = 0xc2b0c0a5;
            auVar96._16_4_ = 0xc2b0c0a5;
            auVar96._20_4_ = 0xc2b0c0a5;
            auVar96._24_4_ = 0xc2b0c0a5;
            auVar96._28_4_ = 0xc2b0c0a5;
            auVar184 = vmaxps_avx512vl(auVar183,auVar96);
            auVar288._8_4_ = 0x3f000000;
            auVar288._0_8_ = 0x3f0000003f000000;
            auVar288._12_4_ = 0x3f000000;
            auVar288._16_4_ = 0x3f000000;
            auVar288._20_4_ = 0x3f000000;
            auVar288._24_4_ = 0x3f000000;
            auVar288._28_4_ = 0x3f000000;
            auVar97._8_4_ = 0x3fb8aa3b;
            auVar97._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar97._12_4_ = 0x3fb8aa3b;
            auVar97._16_4_ = 0x3fb8aa3b;
            auVar97._20_4_ = 0x3fb8aa3b;
            auVar97._24_4_ = 0x3fb8aa3b;
            auVar97._28_4_ = 0x3fb8aa3b;
            auVar185 = vfmadd231ps_avx512vl(auVar288,auVar184,auVar97);
            auVar183 = vroundps_avx(auVar185,1);
            uVar136 = vcmpps_avx512vl(auVar185,auVar183,1);
            auVar293._8_4_ = 0x3f800000;
            auVar293._0_8_ = 0x3f8000003f800000;
            auVar293._12_4_ = 0x3f800000;
            auVar293._16_4_ = 0x3f800000;
            auVar293._20_4_ = 0x3f800000;
            auVar293._24_4_ = 0x3f800000;
            auVar293._28_4_ = 0x3f800000;
            auVar186 = vsubps_avx512vl(auVar183,auVar293);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar206._0_4_ = (float)((uint)bVar11 * auVar186._0_4_ | (uint)!bVar11 * auVar183._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar206._4_4_ = (float)((uint)bVar11 * auVar186._4_4_ | (uint)!bVar11 * auVar183._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar206._8_4_ = (float)((uint)bVar11 * auVar186._8_4_ | (uint)!bVar11 * auVar183._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar206._12_4_ =
                 (float)((uint)bVar11 * auVar186._12_4_ | (uint)!bVar11 * auVar183._12_4_);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar206._16_4_ =
                 (float)((uint)bVar11 * auVar186._16_4_ | (uint)!bVar11 * auVar183._16_4_);
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar206._20_4_ =
                 (float)((uint)bVar11 * auVar186._20_4_ | (uint)!bVar11 * auVar183._20_4_);
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar206._24_4_ =
                 (float)((uint)bVar11 * auVar186._24_4_ | (uint)!bVar11 * auVar183._24_4_);
            bVar11 = SUB81(uVar136 >> 7,0);
            auVar206._28_4_ =
                 (float)((uint)bVar11 * auVar186._28_4_ | (uint)!bVar11 * auVar183._28_4_);
            auVar98._8_4_ = 0x3f318000;
            auVar98._0_8_ = 0x3f3180003f318000;
            auVar98._12_4_ = 0x3f318000;
            auVar98._16_4_ = 0x3f318000;
            auVar98._20_4_ = 0x3f318000;
            auVar98._24_4_ = 0x3f318000;
            auVar98._28_4_ = 0x3f318000;
            auVar183 = vfmsub231ps_avx512vl(auVar184,auVar206,auVar98);
            auVar99._8_4_ = 0x395e8083;
            auVar99._0_8_ = 0x395e8083395e8083;
            auVar99._12_4_ = 0x395e8083;
            auVar99._16_4_ = 0x395e8083;
            auVar99._20_4_ = 0x395e8083;
            auVar99._24_4_ = 0x395e8083;
            auVar99._28_4_ = 0x395e8083;
            auVar183 = vfmsub231ps_avx512vl(auVar183,auVar206,auVar99);
            auVar122._4_4_ = auVar183._4_4_ * auVar183._4_4_;
            auVar122._0_4_ = auVar183._0_4_ * auVar183._0_4_;
            auVar122._8_4_ = auVar183._8_4_ * auVar183._8_4_;
            auVar122._12_4_ = auVar183._12_4_ * auVar183._12_4_;
            auVar122._16_4_ = auVar183._16_4_ * auVar183._16_4_;
            auVar122._20_4_ = auVar183._20_4_ * auVar183._20_4_;
            auVar122._24_4_ = auVar183._24_4_ * auVar183._24_4_;
            auVar122._28_4_ = auVar185._28_4_;
            auVar279._8_4_ = 0x39506967;
            auVar279._0_8_ = 0x3950696739506967;
            auVar279._12_4_ = 0x39506967;
            auVar279._16_4_ = 0x39506967;
            auVar279._20_4_ = 0x39506967;
            auVar279._24_4_ = 0x39506967;
            auVar279._28_4_ = 0x39506967;
            auVar100._8_4_ = 0x3ab743ce;
            auVar100._0_8_ = 0x3ab743ce3ab743ce;
            auVar100._12_4_ = 0x3ab743ce;
            auVar100._16_4_ = 0x3ab743ce;
            auVar100._20_4_ = 0x3ab743ce;
            auVar100._24_4_ = 0x3ab743ce;
            auVar100._28_4_ = 0x3ab743ce;
            auVar184 = vfmadd213ps_avx512vl(auVar279,auVar183,auVar100);
            auVar101._8_4_ = 0x3c088908;
            auVar101._0_8_ = 0x3c0889083c088908;
            auVar101._12_4_ = 0x3c088908;
            auVar101._16_4_ = 0x3c088908;
            auVar101._20_4_ = 0x3c088908;
            auVar101._24_4_ = 0x3c088908;
            auVar101._28_4_ = 0x3c088908;
            auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar101);
            auVar102._8_4_ = 0x3d2aa9c1;
            auVar102._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar102._12_4_ = 0x3d2aa9c1;
            auVar102._16_4_ = 0x3d2aa9c1;
            auVar102._20_4_ = 0x3d2aa9c1;
            auVar102._24_4_ = 0x3d2aa9c1;
            auVar102._28_4_ = 0x3d2aa9c1;
            auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar102);
            auVar103._8_4_ = 0x3e2aaaaa;
            auVar103._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar103._12_4_ = 0x3e2aaaaa;
            auVar103._16_4_ = 0x3e2aaaaa;
            auVar103._20_4_ = 0x3e2aaaaa;
            auVar103._24_4_ = 0x3e2aaaaa;
            auVar103._28_4_ = 0x3e2aaaaa;
            auVar184 = vfmadd213ps_avx512vl(auVar184,auVar183,auVar103);
            auVar157 = vfmadd213ps_fma(auVar184,auVar183,auVar288);
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar122,auVar183);
            auVar230._0_4_ = auVar157._0_4_ + 1.0;
            auVar230._4_4_ = auVar157._4_4_ + 1.0;
            auVar230._8_4_ = auVar157._8_4_ + 1.0;
            auVar230._12_4_ = auVar157._12_4_ + 1.0;
            auVar230._16_4_ = 0x3f800000;
            auVar230._20_4_ = 0x3f800000;
            auVar230._24_4_ = 0x3f800000;
            auVar230._28_4_ = 0x3f800000;
            auVar250._0_4_ = (int)auVar206._0_4_;
            auVar250._4_4_ = (int)auVar206._4_4_;
            auVar250._8_4_ = (int)auVar206._8_4_;
            auVar250._12_4_ = (int)auVar206._12_4_;
            auVar250._16_4_ = (int)auVar206._16_4_;
            auVar250._20_4_ = (int)auVar206._20_4_;
            auVar250._24_4_ = (int)auVar206._24_4_;
            auVar250._28_4_ = (int)auVar206._28_4_;
            auVar183 = vpslld_avx2(auVar250,0x17);
            auVar104._8_4_ = 0x3f800000;
            auVar104._0_8_ = 0x3f8000003f800000;
            auVar104._12_4_ = 0x3f800000;
            auVar104._16_4_ = 0x3f800000;
            auVar104._20_4_ = 0x3f800000;
            auVar104._24_4_ = 0x3f800000;
            auVar104._28_4_ = 0x3f800000;
            auVar183 = vpaddd_avx512vl(auVar183,auVar104);
            auVar157 = vfmadd213ps_fma(auVar183,auVar230,auVar293);
            auVar183 = vrcpps_avx(ZEXT1632(auVar157));
            auVar157 = vfmsub213ps_fma(ZEXT1632(auVar157),auVar183,auVar293);
            auVar157 = vfnmadd132ps_fma(ZEXT1632(auVar157),auVar183,auVar183);
            auVar185 = ZEXT1632(auVar157);
            break;
          case 5:
            auVar297._8_4_ = 0x42b0c0a5;
            auVar297._0_8_ = 0x42b0c0a542b0c0a5;
            auVar297._12_4_ = 0x42b0c0a5;
            auVar297._16_4_ = 0x42b0c0a5;
            auVar297._20_4_ = 0x42b0c0a5;
            auVar297._24_4_ = 0x42b0c0a5;
            auVar297._28_4_ = 0x42b0c0a5;
            auVar183 = vminps_avx(auVar186,auVar297);
            auVar302._8_4_ = 0xc2b0c0a5;
            auVar302._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar302._12_4_ = 0xc2b0c0a5;
            auVar302._16_4_ = 0xc2b0c0a5;
            auVar302._20_4_ = 0xc2b0c0a5;
            auVar302._24_4_ = 0xc2b0c0a5;
            auVar302._28_4_ = 0xc2b0c0a5;
            auVar183 = vmaxps_avx(auVar183,auVar302);
            auVar310._8_4_ = 0x3fb8aa3b;
            auVar310._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar310._12_4_ = 0x3fb8aa3b;
            auVar310._16_4_ = 0x3fb8aa3b;
            auVar310._20_4_ = 0x3fb8aa3b;
            auVar310._24_4_ = 0x3fb8aa3b;
            auVar310._28_4_ = 0x3fb8aa3b;
            auVar306._8_4_ = 0x3f000000;
            auVar306._0_8_ = 0x3f0000003f000000;
            auVar306._12_4_ = 0x3f000000;
            auVar306._16_4_ = 0x3f000000;
            auVar306._20_4_ = 0x3f000000;
            auVar306._24_4_ = 0x3f000000;
            auVar306._28_4_ = 0x3f000000;
            auVar157 = vfmadd213ps_fma(auVar310,auVar183,auVar306);
            auVar184 = vroundps_avx(ZEXT1632(auVar157),1);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar157),auVar184,1);
            auVar314._8_4_ = 0x3f800000;
            auVar314._0_8_ = 0x3f8000003f800000;
            auVar314._12_4_ = 0x3f800000;
            auVar314._16_4_ = 0x3f800000;
            auVar314._20_4_ = 0x3f800000;
            auVar314._24_4_ = 0x3f800000;
            auVar314._28_4_ = 0x3f800000;
            auVar185 = vsubps_avx512vl(auVar184,auVar314);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar267._0_4_ = (float)((uint)bVar11 * auVar185._0_4_ | (uint)!bVar11 * auVar184._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar267._4_4_ = (float)((uint)bVar11 * auVar185._4_4_ | (uint)!bVar11 * auVar184._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar267._8_4_ = (float)((uint)bVar11 * auVar185._8_4_ | (uint)!bVar11 * auVar184._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar267._12_4_ =
                 (float)((uint)bVar11 * auVar185._12_4_ | (uint)!bVar11 * auVar184._12_4_);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar267._16_4_ =
                 (float)((uint)bVar11 * auVar185._16_4_ | (uint)!bVar11 * auVar184._16_4_);
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar267._20_4_ =
                 (float)((uint)bVar11 * auVar185._20_4_ | (uint)!bVar11 * auVar184._20_4_);
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar267._24_4_ =
                 (float)((uint)bVar11 * auVar185._24_4_ | (uint)!bVar11 * auVar184._24_4_);
            bVar11 = SUB81(uVar136 >> 7,0);
            auVar267._28_4_ =
                 (float)((uint)bVar11 * auVar185._28_4_ | (uint)!bVar11 * auVar184._28_4_);
            auVar318._8_4_ = 0x3f318000;
            auVar318._0_8_ = 0x3f3180003f318000;
            auVar318._12_4_ = 0x3f318000;
            auVar318._16_4_ = 0x3f318000;
            auVar318._20_4_ = 0x3f318000;
            auVar318._24_4_ = 0x3f318000;
            auVar318._28_4_ = 0x3f318000;
            auVar157 = vfmsub231ps_fma(auVar183,auVar267,auVar318);
            auVar185 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar183 = vfnmsub231ps_avx512vl(ZEXT1632(auVar157),auVar267,auVar185);
            auVar265._0_4_ = auVar183._0_4_ * auVar183._0_4_;
            auVar265._4_4_ = auVar183._4_4_ * auVar183._4_4_;
            auVar265._8_4_ = auVar183._8_4_ * auVar183._8_4_;
            auVar265._12_4_ = auVar183._12_4_ * auVar183._12_4_;
            auVar265._16_4_ = auVar183._16_4_ * auVar183._16_4_;
            auVar265._20_4_ = auVar183._20_4_ * auVar183._20_4_;
            auVar265._24_4_ = auVar183._24_4_ * auVar183._24_4_;
            auVar265._28_4_ = 0;
            auVar322._8_4_ = 0x39506967;
            auVar322._0_8_ = 0x3950696739506967;
            auVar322._12_4_ = 0x39506967;
            auVar322._16_4_ = 0x39506967;
            auVar322._20_4_ = 0x39506967;
            auVar322._24_4_ = 0x39506967;
            auVar322._28_4_ = 0x39506967;
            auVar326._8_4_ = 0x3ab743ce;
            auVar326._0_8_ = 0x3ab743ce3ab743ce;
            auVar326._12_4_ = 0x3ab743ce;
            auVar326._16_4_ = 0x3ab743ce;
            auVar326._20_4_ = 0x3ab743ce;
            auVar326._24_4_ = 0x3ab743ce;
            auVar326._28_4_ = 0x3ab743ce;
            auVar157 = vfmadd213ps_fma(auVar322,auVar183,auVar326);
            auVar330._8_4_ = 0x3c088908;
            auVar330._0_8_ = 0x3c0889083c088908;
            auVar330._12_4_ = 0x3c088908;
            auVar330._16_4_ = 0x3c088908;
            auVar330._20_4_ = 0x3c088908;
            auVar330._24_4_ = 0x3c088908;
            auVar330._28_4_ = 0x3c088908;
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar183,auVar330);
            auVar333._8_4_ = 0x3d2aa9c1;
            auVar333._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar333._12_4_ = 0x3d2aa9c1;
            auVar333._16_4_ = 0x3d2aa9c1;
            auVar333._20_4_ = 0x3d2aa9c1;
            auVar333._24_4_ = 0x3d2aa9c1;
            auVar333._28_4_ = 0x3d2aa9c1;
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar183,auVar333);
            auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar184 = vfmadd213ps_avx512vl(ZEXT1632(auVar157),auVar183,auVar187);
            auVar157 = vfmadd213ps_fma(auVar184,auVar183,auVar306);
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar265,auVar183);
            auVar248._0_4_ = auVar157._0_4_ + 1.0;
            auVar248._4_4_ = auVar157._4_4_ + 1.0;
            auVar248._8_4_ = auVar157._8_4_ + 1.0;
            auVar248._12_4_ = auVar157._12_4_ + 1.0;
            auVar248._16_4_ = 0x3f800000;
            auVar248._20_4_ = 0x3f800000;
            auVar248._24_4_ = 0x3f800000;
            auVar248._28_4_ = 0x3f800000;
            auVar266._0_4_ = (int)auVar267._0_4_;
            auVar266._4_4_ = (int)auVar267._4_4_;
            auVar266._8_4_ = (int)auVar267._8_4_;
            auVar266._12_4_ = (int)auVar267._12_4_;
            auVar266._16_4_ = (int)auVar267._16_4_;
            auVar266._20_4_ = (int)auVar267._20_4_;
            auVar266._24_4_ = (int)auVar267._24_4_;
            auVar266._28_4_ = (int)auVar267._28_4_;
            auVar183 = vpslld_avx2(auVar266,0x17);
            auVar188 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar183 = vpaddd_avx512vl(auVar183,auVar188);
            auVar157 = vfmadd213ps_fma(auVar183,auVar248,auVar314);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar157),ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar190._8_4_ = 0x800000;
            auVar190._0_8_ = 0x80000000800000;
            auVar190._12_4_ = 0x800000;
            auVar190._16_4_ = 0x800000;
            auVar190._20_4_ = 0x800000;
            auVar190._24_4_ = 0x800000;
            auVar190._28_4_ = 0x800000;
            auVar183 = vmaxps_avx512vl(ZEXT1632(auVar157),auVar190);
            auVar267 = vpsrld_avx2(auVar183,0x17);
            auVar278._8_4_ = 0x807fffff;
            auVar278._0_8_ = 0x807fffff807fffff;
            auVar278._12_4_ = 0x807fffff;
            auVar278._16_4_ = 0x807fffff;
            auVar278._20_4_ = 0x807fffff;
            auVar278._24_4_ = 0x807fffff;
            auVar278._28_4_ = 0x807fffff;
            auVar193._8_4_ = 0x3f000000;
            auVar193._0_8_ = 0x3f0000003f000000;
            auVar193._12_4_ = 0x3f000000;
            auVar193._16_4_ = 0x3f000000;
            auVar193._20_4_ = 0x3f000000;
            auVar193._24_4_ = 0x3f000000;
            auVar193._28_4_ = 0x3f000000;
            auVar183 = vpternlogd_avx512vl(auVar183,auVar278,auVar193,0xea);
            auVar194._8_4_ = 0x3f3504f3;
            auVar194._0_8_ = 0x3f3504f33f3504f3;
            auVar194._12_4_ = 0x3f3504f3;
            auVar194._16_4_ = 0x3f3504f3;
            auVar194._20_4_ = 0x3f3504f3;
            auVar194._24_4_ = 0x3f3504f3;
            auVar194._28_4_ = 0x3f3504f3;
            uVar13 = vcmpps_avx512vl(auVar183,auVar194,1);
            auVar189 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar184 = vaddps_avx512vl(auVar183,auVar189);
            auVar190 = vaddps_avx512vl(auVar184,auVar183);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar202._0_4_ = (float)((uint)bVar11 * auVar190._0_4_ | (uint)!bVar11 * auVar184._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar202._4_4_ = (float)((uint)bVar11 * auVar190._4_4_ | (uint)!bVar11 * auVar184._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar202._8_4_ = (float)((uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * auVar184._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar202._12_4_ =
                 (float)((uint)bVar11 * auVar190._12_4_ | (uint)!bVar11 * auVar184._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar202._16_4_ =
                 (float)((uint)bVar11 * auVar190._16_4_ | (uint)!bVar11 * auVar184._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar202._20_4_ =
                 (float)((uint)bVar11 * auVar190._20_4_ | (uint)!bVar11 * auVar184._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar202._24_4_ =
                 (float)((uint)bVar11 * auVar190._24_4_ | (uint)!bVar11 * auVar184._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar202._28_4_ = (uint)bVar11 * auVar190._28_4_ | (uint)!bVar11 * auVar184._28_4_;
            auVar120._4_4_ = auVar202._4_4_ * auVar202._4_4_;
            auVar120._0_4_ = auVar202._0_4_ * auVar202._0_4_;
            auVar120._8_4_ = auVar202._8_4_ * auVar202._8_4_;
            auVar120._12_4_ = auVar202._12_4_ * auVar202._12_4_;
            auVar120._16_4_ = auVar202._16_4_ * auVar202._16_4_;
            auVar120._20_4_ = auVar202._20_4_ * auVar202._20_4_;
            auVar120._24_4_ = auVar202._24_4_ * auVar202._24_4_;
            auVar120._28_4_ = auVar183._28_4_;
            auVar287._8_4_ = 0x3d9021bb;
            auVar287._0_8_ = 0x3d9021bb3d9021bb;
            auVar287._12_4_ = 0x3d9021bb;
            auVar287._16_4_ = 0x3d9021bb;
            auVar287._20_4_ = 0x3d9021bb;
            auVar287._24_4_ = 0x3d9021bb;
            auVar287._28_4_ = 0x3d9021bb;
            auVar191._8_4_ = 0xbdebd1b8;
            auVar191._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar191._12_4_ = 0xbdebd1b8;
            auVar191._16_4_ = 0xbdebd1b8;
            auVar191._20_4_ = 0xbdebd1b8;
            auVar191._24_4_ = 0xbdebd1b8;
            auVar191._28_4_ = 0xbdebd1b8;
            auVar183 = vfmadd213ps_avx512vl(auVar287,auVar202,auVar191);
            auVar192._8_4_ = 0x3def251a;
            auVar192._0_8_ = 0x3def251a3def251a;
            auVar192._12_4_ = 0x3def251a;
            auVar192._16_4_ = 0x3def251a;
            auVar192._20_4_ = 0x3def251a;
            auVar192._24_4_ = 0x3def251a;
            auVar192._28_4_ = 0x3def251a;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar192);
            auVar87._8_4_ = 0xbdfe5d4f;
            auVar87._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar87._12_4_ = 0xbdfe5d4f;
            auVar87._16_4_ = 0xbdfe5d4f;
            auVar87._20_4_ = 0xbdfe5d4f;
            auVar87._24_4_ = 0xbdfe5d4f;
            auVar87._28_4_ = 0xbdfe5d4f;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar87);
            auVar88._8_4_ = 0x3e11e9bf;
            auVar88._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar88._12_4_ = 0x3e11e9bf;
            auVar88._16_4_ = 0x3e11e9bf;
            auVar88._20_4_ = 0x3e11e9bf;
            auVar88._24_4_ = 0x3e11e9bf;
            auVar88._28_4_ = 0x3e11e9bf;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar88);
            auVar89._8_4_ = 0xbe2aae50;
            auVar89._0_8_ = 0xbe2aae50be2aae50;
            auVar89._12_4_ = 0xbe2aae50;
            auVar89._16_4_ = 0xbe2aae50;
            auVar89._20_4_ = 0xbe2aae50;
            auVar89._24_4_ = 0xbe2aae50;
            auVar89._28_4_ = 0xbe2aae50;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar89);
            auVar90._8_4_ = 0x3e4cceac;
            auVar90._0_8_ = 0x3e4cceac3e4cceac;
            auVar90._12_4_ = 0x3e4cceac;
            auVar90._16_4_ = 0x3e4cceac;
            auVar90._20_4_ = 0x3e4cceac;
            auVar90._24_4_ = 0x3e4cceac;
            auVar90._28_4_ = 0x3e4cceac;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar90);
            auVar91._8_4_ = 0xbe7ffffc;
            auVar91._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar91._12_4_ = 0xbe7ffffc;
            auVar91._16_4_ = 0xbe7ffffc;
            auVar91._20_4_ = 0xbe7ffffc;
            auVar91._24_4_ = 0xbe7ffffc;
            auVar91._28_4_ = 0xbe7ffffc;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar91);
            auVar92._8_4_ = 0x3eaaaaaa;
            auVar92._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar92._12_4_ = 0x3eaaaaaa;
            auVar92._16_4_ = 0x3eaaaaaa;
            auVar92._20_4_ = 0x3eaaaaaa;
            auVar92._24_4_ = 0x3eaaaaaa;
            auVar92._28_4_ = 0x3eaaaaaa;
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar202,auVar92);
            auVar121._4_4_ = auVar202._4_4_ * auVar202._4_4_ * auVar202._4_4_ * auVar183._4_4_;
            auVar121._0_4_ = auVar202._0_4_ * auVar202._0_4_ * auVar202._0_4_ * auVar183._0_4_;
            auVar121._8_4_ = auVar202._8_4_ * auVar202._8_4_ * auVar202._8_4_ * auVar183._8_4_;
            auVar121._12_4_ = auVar202._12_4_ * auVar202._12_4_ * auVar202._12_4_ * auVar183._12_4_;
            auVar121._16_4_ = auVar202._16_4_ * auVar202._16_4_ * auVar202._16_4_ * auVar183._16_4_;
            auVar121._20_4_ = auVar202._20_4_ * auVar202._20_4_ * auVar202._20_4_ * auVar183._20_4_;
            auVar121._24_4_ = auVar202._24_4_ * auVar202._24_4_ * auVar202._24_4_ * auVar183._24_4_;
            auVar121._28_4_ = auVar183._28_4_;
            auVar93._8_4_ = 0xffffff82;
            auVar93._0_8_ = 0xffffff82ffffff82;
            auVar93._12_4_ = 0xffffff82;
            auVar93._16_4_ = 0xffffff82;
            auVar93._20_4_ = 0xffffff82;
            auVar93._24_4_ = 0xffffff82;
            auVar93._28_4_ = 0xffffff82;
            auVar183 = vpaddd_avx512vl(auVar267,auVar93);
            auVar183 = vcvtdq2ps_avx(auVar183);
            auVar184 = vsubps_avx512vl(auVar183,auVar314);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar203._0_4_ = (uint)bVar11 * auVar184._0_4_ | (uint)!bVar11 * auVar183._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar203._4_4_ = (uint)bVar11 * auVar184._4_4_ | (uint)!bVar11 * auVar183._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar203._8_4_ = (uint)bVar11 * auVar184._8_4_ | (uint)!bVar11 * auVar183._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar203._12_4_ = (uint)bVar11 * auVar184._12_4_ | (uint)!bVar11 * auVar183._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar203._16_4_ = (uint)bVar11 * auVar184._16_4_ | (uint)!bVar11 * auVar183._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar203._20_4_ = (uint)bVar11 * auVar184._20_4_ | (uint)!bVar11 * auVar183._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar203._24_4_ = (uint)bVar11 * auVar184._24_4_ | (uint)!bVar11 * auVar183._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar203._28_4_ = (uint)bVar11 * auVar184._28_4_ | (uint)!bVar11 * auVar183._28_4_;
            auVar183 = vfmadd231ps_avx512vl(auVar121,auVar203,auVar185);
            auVar157 = vfmsub231ps_fma(auVar183,auVar306,auVar120);
            auVar183 = vsubps_avx(ZEXT1632(auVar157),auVar202);
            auVar157 = vfmsub231ps_fma(auVar183,auVar318,auVar203);
            auVar292._8_4_ = 0xc0000000;
            auVar292._0_8_ = 0xc0000000c0000000;
            auVar292._12_4_ = 0xc0000000;
            auVar292._16_4_ = 0xc0000000;
            auVar292._20_4_ = 0xc0000000;
            auVar292._24_4_ = 0xc0000000;
            auVar292._28_4_ = 0xc0000000;
            auVar183 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar204._0_4_ =
                 (uint)bVar11 * auVar183._0_4_ | (uint)!bVar11 * (int)(auVar157._0_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar204._4_4_ =
                 (uint)bVar11 * auVar183._4_4_ | (uint)!bVar11 * (int)(auVar157._4_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar204._8_4_ =
                 (uint)bVar11 * auVar183._8_4_ | (uint)!bVar11 * (int)(auVar157._8_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar204._12_4_ =
                 (uint)bVar11 * auVar183._12_4_ | (uint)!bVar11 * (int)(auVar157._12_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar204._16_4_ = (uint)bVar11 * auVar183._16_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar204._20_4_ = (uint)bVar11 * auVar183._20_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar204._24_4_ = (uint)bVar11 * auVar183._24_4_ | (uint)!bVar11 * -0x80000000;
            auVar204._28_4_ = (uint)(byte)(uVar136 >> 7) * auVar183._28_4_;
            auVar183 = vminps_avx(auVar204,auVar297);
            auVar183 = vmaxps_avx(auVar183,auVar302);
            auVar157 = vfmadd213ps_fma(auVar310,auVar183,auVar306);
            auVar184 = vroundps_avx(ZEXT1632(auVar157),1);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar157),auVar184,1);
            auVar190 = vsubps_avx512vl(auVar184,auVar314);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar205._0_4_ = (float)((uint)bVar11 * auVar190._0_4_ | (uint)!bVar11 * auVar184._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar205._4_4_ = (float)((uint)bVar11 * auVar190._4_4_ | (uint)!bVar11 * auVar184._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar205._8_4_ = (float)((uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * auVar184._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar205._12_4_ =
                 (float)((uint)bVar11 * auVar190._12_4_ | (uint)!bVar11 * auVar184._12_4_);
            bVar11 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar205._16_4_ =
                 (float)((uint)bVar11 * auVar190._16_4_ | (uint)!bVar11 * auVar184._16_4_);
            bVar11 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar205._20_4_ =
                 (float)((uint)bVar11 * auVar190._20_4_ | (uint)!bVar11 * auVar184._20_4_);
            bVar11 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar205._24_4_ =
                 (float)((uint)bVar11 * auVar190._24_4_ | (uint)!bVar11 * auVar184._24_4_);
            bVar11 = SUB81(uVar136 >> 7,0);
            auVar205._28_4_ =
                 (float)((uint)bVar11 * auVar190._28_4_ | (uint)!bVar11 * auVar184._28_4_);
            auVar157 = vfmsub231ps_fma(auVar183,auVar205,auVar318);
            auVar183 = vfnmsub231ps_avx512vl(ZEXT1632(auVar157),auVar205,auVar185);
            auVar268._0_4_ = auVar183._0_4_ * auVar183._0_4_;
            auVar268._4_4_ = auVar183._4_4_ * auVar183._4_4_;
            auVar268._8_4_ = auVar183._8_4_ * auVar183._8_4_;
            auVar268._12_4_ = auVar183._12_4_ * auVar183._12_4_;
            auVar268._16_4_ = auVar183._16_4_ * auVar183._16_4_;
            auVar268._20_4_ = auVar183._20_4_ * auVar183._20_4_;
            auVar268._24_4_ = auVar183._24_4_ * auVar183._24_4_;
            auVar268._28_4_ = 0;
            auVar157 = vfmadd213ps_fma(auVar322,auVar183,auVar326);
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar183,auVar330);
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar183,auVar333);
            auVar184 = vfmadd213ps_avx512vl(ZEXT1632(auVar157),auVar183,auVar187);
            auVar157 = vfmadd213ps_fma(auVar184,auVar183,auVar306);
            auVar157 = vfmadd213ps_fma(ZEXT1632(auVar157),auVar268,auVar183);
            auVar249._0_4_ = auVar157._0_4_ + 1.0;
            auVar249._4_4_ = auVar157._4_4_ + 1.0;
            auVar249._8_4_ = auVar157._8_4_ + 1.0;
            auVar249._12_4_ = auVar157._12_4_ + 1.0;
            auVar249._16_4_ = 0x3f800000;
            auVar249._20_4_ = 0x3f800000;
            auVar249._24_4_ = 0x3f800000;
            auVar249._28_4_ = 0x3f800000;
            auVar269._0_4_ = (int)auVar205._0_4_;
            auVar269._4_4_ = (int)auVar205._4_4_;
            auVar269._8_4_ = (int)auVar205._8_4_;
            auVar269._12_4_ = (int)auVar205._12_4_;
            auVar269._16_4_ = (int)auVar205._16_4_;
            auVar269._20_4_ = (int)auVar205._20_4_;
            auVar269._24_4_ = (int)auVar205._24_4_;
            auVar269._28_4_ = (int)auVar205._28_4_;
            auVar183 = vpslld_avx2(auVar269,0x17);
            auVar183 = vpaddd_avx512vl(auVar183,auVar188);
            auVar157 = vfmadd213ps_fma(auVar183,auVar249,auVar314);
            auVar183 = vrcpps_avx(ZEXT1632(auVar157));
            auVar157 = vfmsub213ps_fma(ZEXT1632(auVar157),auVar183,auVar314);
            auVar157 = vfnmadd132ps_fma(ZEXT1632(auVar157),auVar183,auVar183);
            auVar184 = vfnmadd213ps_avx512vl(ZEXT1632(auVar157),auVar292,auVar189);
            auVar185._4_4_ = auVar184._4_4_ * auVar186._4_4_;
            auVar185._0_4_ = auVar184._0_4_ * auVar186._0_4_;
            auVar185._8_4_ = auVar184._8_4_ * auVar186._8_4_;
            auVar185._12_4_ = auVar184._12_4_ * auVar186._12_4_;
            auVar185._16_4_ = auVar184._16_4_ * auVar186._16_4_;
            auVar185._20_4_ = auVar184._20_4_ * auVar186._20_4_;
            auVar185._24_4_ = auVar184._24_4_ * auVar186._24_4_;
            auVar185._28_4_ = auVar183._28_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar189._4_4_ = uVar1;
            auVar189._0_4_ = uVar1;
            auVar189._8_4_ = uVar1;
            auVar189._12_4_ = uVar1;
            auVar189._16_4_ = uVar1;
            auVar189._20_4_ = uVar1;
            auVar189._24_4_ = uVar1;
            auVar189._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar187._4_4_ = uVar1;
            auVar187._0_4_ = uVar1;
            auVar187._8_4_ = uVar1;
            auVar187._12_4_ = uVar1;
            auVar187._16_4_ = uVar1;
            auVar187._20_4_ = uVar1;
            auVar187._24_4_ = uVar1;
            auVar187._28_4_ = uVar1;
            auVar183 = vfmadd213ps_avx512vl(auVar189,auVar186,auVar187);
            auVar183 = vmaxps_avx(auVar183,ZEXT832(0) << 0x20);
            auVar188._8_4_ = 0x3f800000;
            auVar188._0_8_ = 0x3f8000003f800000;
            auVar188._12_4_ = 0x3f800000;
            auVar188._16_4_ = 0x3f800000;
            auVar188._20_4_ = 0x3f800000;
            auVar188._24_4_ = 0x3f800000;
            auVar188._28_4_ = 0x3f800000;
            auVar183 = vminps_avx512vl(auVar183,auVar188);
            auVar185._4_4_ = auVar183._4_4_ * auVar186._4_4_;
            auVar185._0_4_ = auVar183._0_4_ * auVar186._0_4_;
            auVar185._8_4_ = auVar183._8_4_ * auVar186._8_4_;
            auVar185._12_4_ = auVar183._12_4_ * auVar186._12_4_;
            auVar185._16_4_ = auVar183._16_4_ * auVar186._16_4_;
            auVar185._20_4_ = auVar183._20_4_ * auVar186._20_4_;
            auVar185._24_4_ = auVar183._24_4_ * auVar186._24_4_;
            auVar185._28_4_ = auVar183._28_4_;
          }
        }
        *(undefined1 (*) [32])((long)top_blob->data + local_1d0 * 4) = auVar185;
        uVar153 = uVar153 + 8;
        lVar138 = local_1c0 + 8;
        lVar142 = lVar142 + 8;
        lVar145 = lVar145 + 8;
        lVar147 = lVar147 + 8;
        lVar150 = lVar150 + 8;
        lVar152 = lVar152 + 8;
        lVar140 = lVar140 + 8;
        uVar136 = local_1c8 + 1;
      }
      uVar153 = (long)(int)uVar5 & 0xfffffffffffffff8;
      uVar135 = uVar5 >> 2 & 1;
      local_2d8 = uVar153 + 1;
      local_2e8._0_8_ = uVar153 + 2;
      local_158._0_8_ = uVar153 + 3;
      local_1b8._0_8_ = uVar153;
      local_178._0_8_ = uVar153;
      uVar153 = 0;
      while (pauVar146 = local_338, uVar153 != uVar135) {
        uVar136 = local_1b8._0_8_ + uVar153 * 4;
        local_198._0_8_ = uVar153;
        if (lVar8 == 0) {
          auVar157 = ZEXT816(0) << 0x40;
        }
        else {
          auVar157 = *(undefined1 (*) [16])(lVar8 + uVar136 * 4);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar142 = (long)(this->weight_data_tm).w;
        lVar138 = sVar10 * lVar142;
        local_138._0_8_ = uVar136;
        pauVar151 = (undefined1 (*) [16])(lVar138 * uVar136 + (long)pvVar9);
        pauVar143 = (undefined1 (*) [16])((uVar136 | 1) * lVar138 + (long)pvVar9);
        pauVar144 = (undefined1 (*) [16])((uVar136 | 2) * lVar138 + (long)pvVar9);
        pauVar148 = (undefined1 (*) [16])(lVar138 * (uVar136 | 3) + (long)pvVar9);
        lVar145 = 0;
        auVar176 = ZEXT816(0) << 0x40;
        lVar138 = 0;
        auVar158 = ZEXT816(0) << 0x40;
        auVar159 = ZEXT816(0) << 0x40;
        auVar160 = ZEXT816(0) << 0x40;
        iVar149 = 0;
        pauVar137 = local_338;
        while( true ) {
          auVar210 = ZEXT1664(auVar160);
          auVar209 = ZEXT1664(auVar159);
          auVar208 = ZEXT1664(auVar158);
          auVar207 = ZEXT1664(auVar176);
          local_b8 = ZEXT1632(auVar176);
          local_d8 = ZEXT1632(auVar158);
          local_f8 = ZEXT1632(auVar159);
          local_118 = ZEXT1632(auVar160);
          if (iVar141 <= iVar149 + 7) break;
          auVar183 = *pauVar137;
          auVar176 = vlddqu_avx(*pauVar151);
          auVar184 = vcvtph2ps_f16c(auVar176);
          auVar176 = vlddqu_avx(*pauVar143);
          auVar185 = vcvtph2ps_f16c(auVar176);
          auVar176 = vlddqu_avx(*pauVar144);
          auVar186 = vcvtph2ps_f16c(auVar176);
          auVar176 = vlddqu_avx(*pauVar148);
          auVar187 = vcvtph2ps_f16c(auVar176);
          auVar176 = vfmadd231ps_fma(local_b8,auVar183,auVar184);
          auVar158 = vfmadd231ps_fma(local_d8,auVar183,auVar185);
          auVar159 = vfmadd231ps_fma(local_f8,auVar183,auVar186);
          auVar160 = vfmadd231ps_fma(local_118,auVar183,auVar187);
          pauVar137 = pauVar137 + 1;
          pauVar151 = pauVar151 + 1;
          pauVar143 = pauVar143 + 1;
          pauVar144 = pauVar144 + 1;
          pauVar148 = pauVar148 + 1;
          iVar149 = iVar149 + 8;
          lVar138 = lVar138 + 0x10;
          lVar145 = lVar145 + 8;
        }
        lVar150 = sVar10 * local_178._0_8_ * lVar142;
        lVar152 = sVar10 * local_2d8 * lVar142;
        lVar147 = sVar10 * local_2e8._0_8_ * lVar142;
        lVar142 = sVar10 * local_158._0_8_ * lVar142;
        local_298 = ZEXT816(0) << 0x40;
        local_2a8 = ZEXT816(0) << 0x40;
        local_2b8 = ZEXT816(0) << 0x40;
        local_2c8 = ZEXT816(0) << 0x40;
        for (; iVar149 + 3 < iVar141; iVar149 = iVar149 + 4) {
          auVar158._8_8_ = 0;
          auVar158._0_8_ = *(ulong *)((long)pvVar9 + lVar138 + lVar150);
          auVar158 = vcvtph2ps_f16c(auVar158);
          auVar159._8_8_ = 0;
          auVar159._0_8_ = *(ulong *)((long)pvVar9 + lVar138 + lVar152);
          auVar159 = vcvtph2ps_f16c(auVar159);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)((long)pvVar9 + lVar138 + lVar147);
          auVar160 = vcvtph2ps_f16c(auVar160);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = *(ulong *)((long)pvVar9 + lVar138 + lVar142);
          auVar161 = vcvtph2ps_f16c(auVar161);
          auVar176 = *(undefined1 (*) [16])(*local_338 + lVar138 * 2);
          local_298 = vfmadd231ps_fma(local_298,auVar176,auVar158);
          local_2a8 = vfmadd231ps_fma(local_2a8,auVar176,auVar159);
          local_2b8 = vfmadd231ps_fma(local_2b8,auVar176,auVar160);
          local_2c8 = vfmadd231ps_fma(local_2c8,auVar176,auVar161);
          lVar138 = lVar138 + 8;
          lVar145 = lVar145 + 4;
        }
        for (; (int)lVar145 < iVar141; lVar145 = lVar145 + 1) {
          local_1f8._0_16_ = auVar157;
          local_218._0_16_ = ZEXT416(*(uint *)(*pauVar146 + lVar145 * 4));
          fVar251 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar150));
          auVar183 = local_238;
          local_238._4_4_ = extraout_XMM0_Db_05;
          local_238._0_4_ = fVar251;
          local_238._8_4_ = extraout_XMM0_Dc_04;
          local_238._16_16_ = auVar183._16_16_;
          local_238._12_4_ = extraout_XMM0_Dd_04;
          local_248 = ZEXT416(*(uint *)(*pauVar146 + lVar145 * 4));
          local_258 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar152));
          local_268 = ZEXT416(*(uint *)(*pauVar146 + lVar145 * 4));
          local_278 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar147));
          local_288 = ZEXT416(*(uint *)(*pauVar146 + lVar145 * 4));
          auVar208._0_4_ =
               float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar145 * 2 + lVar142));
          auVar208._4_60_ = extraout_var_00;
          auVar157 = vinsertps_avx(local_238._0_16_,ZEXT416((uint)local_258),0x10);
          auVar157 = vinsertps_avx(auVar157,ZEXT416((uint)local_278),0x20);
          auVar157 = vinsertps_avx(auVar157,auVar208._0_16_,0x30);
          auVar176 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_248._0_4_),0x10);
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_268._0_4_),0x20);
          auVar176 = vinsertps_avx(auVar176,ZEXT416((uint)local_288._0_4_),0x30);
          auVar157 = vfmadd231ps_fma(local_1f8._0_16_,auVar157,auVar176);
          auVar207 = ZEXT3264(local_b8);
          auVar208 = ZEXT3264(local_d8);
          auVar209 = ZEXT3264(local_f8);
          auVar210 = ZEXT3264(local_118);
        }
        auVar183 = vhaddps_avx(auVar207._0_32_,auVar208._0_32_);
        auVar184 = vhaddps_avx(auVar209._0_32_,auVar210._0_32_);
        auVar183 = vhaddps_avx(auVar183,auVar184);
        auVar158 = vunpcklps_avx(local_298,local_2a8);
        auVar159 = vunpcklps_avx(local_2b8,local_2c8);
        auVar160 = vunpckhps_avx(local_298,local_2a8);
        auVar161 = vunpckhps_avx(local_2b8,local_2c8);
        auVar176 = vmovlhps_avx(auVar158,auVar159);
        auVar159 = vunpckhpd_avx(auVar158,auVar159);
        auVar158 = vmovlhps_avx(auVar160,auVar161);
        auVar160 = vunpckhpd_avx(auVar160,auVar161);
        auVar162._0_4_ =
             auVar159._0_4_ + auVar176._0_4_ + auVar158._0_4_ + auVar160._0_4_ + auVar157._0_4_ +
             auVar183._0_4_ + auVar183._16_4_;
        auVar162._4_4_ =
             auVar159._4_4_ + auVar176._4_4_ + auVar158._4_4_ + auVar160._4_4_ + auVar157._4_4_ +
             auVar183._4_4_ + auVar183._20_4_;
        auVar162._8_4_ =
             auVar159._8_4_ + auVar176._8_4_ + auVar158._8_4_ + auVar160._8_4_ + auVar157._8_4_ +
             auVar183._8_4_ + auVar183._24_4_;
        auVar162._12_4_ =
             auVar159._12_4_ + auVar176._12_4_ + auVar158._12_4_ + auVar160._12_4_ + auVar157._12_4_
             + auVar183._12_4_ + auVar183._28_4_;
        auVar157 = auVar162;
        if (iVar134 - 1U < 6) {
          auVar176 = ZEXT816(0) << 0x20;
          auVar157 = vmaxps_avx(auVar162,auVar176);
          switch(iVar134) {
          case 2:
            auVar176 = vminps_avx(auVar162,auVar176);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar57._4_4_ = uVar1;
            auVar57._0_4_ = uVar1;
            auVar57._8_4_ = uVar1;
            auVar57._12_4_ = uVar1;
            auVar157 = vfmadd231ps_avx512vl(auVar157,auVar176,auVar57);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar55._4_4_ = uVar1;
            auVar55._0_4_ = uVar1;
            auVar55._8_4_ = uVar1;
            auVar55._12_4_ = uVar1;
            auVar157 = vmaxps_avx512vl(auVar162,auVar55);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar56._4_4_ = uVar1;
            auVar56._0_4_ = uVar1;
            auVar56._8_4_ = uVar1;
            auVar56._12_4_ = uVar1;
            auVar157 = vminps_avx512vl(auVar157,auVar56);
            break;
          case 4:
            auVar44._8_4_ = 0x80000000;
            auVar44._0_8_ = 0x8000000080000000;
            auVar44._12_4_ = 0x80000000;
            auVar157 = vxorps_avx512vl(auVar162,auVar44);
            auVar45._8_4_ = 0x42b0c0a5;
            auVar45._0_8_ = 0x42b0c0a542b0c0a5;
            auVar45._12_4_ = 0x42b0c0a5;
            auVar157 = vminps_avx512vl(auVar157,auVar45);
            auVar46._8_4_ = 0xc2b0c0a5;
            auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar46._12_4_ = 0xc2b0c0a5;
            auVar176 = vmaxps_avx512vl(auVar157,auVar46);
            auVar285._8_4_ = 0x3f000000;
            auVar285._0_8_ = 0x3f0000003f000000;
            auVar285._12_4_ = 0x3f000000;
            auVar47._8_4_ = 0x3fb8aa3b;
            auVar47._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar47._12_4_ = 0x3fb8aa3b;
            auVar158 = vfmadd231ps_avx512vl(auVar285,auVar176,auVar47);
            auVar262._0_4_ = (int)auVar158._0_4_;
            auVar262._4_4_ = (int)auVar158._4_4_;
            auVar262._8_4_ = (int)auVar158._8_4_;
            auVar262._12_4_ = (int)auVar158._12_4_;
            auVar157 = vcvtdq2ps_avx(auVar262);
            uVar153 = vcmpps_avx512vl(auVar158,auVar157,1);
            auVar290._8_4_ = 0x3f800000;
            auVar290._0_8_ = 0x3f8000003f800000;
            auVar290._12_4_ = 0x3f800000;
            auVar158 = vsubps_avx512vl(auVar157,auVar290);
            bVar11 = (bool)((byte)uVar153 & 1);
            auVar182._0_4_ = (float)((uint)bVar11 * auVar158._0_4_ | (uint)!bVar11 * auVar157._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 1) & 1);
            auVar182._4_4_ = (float)((uint)bVar11 * auVar158._4_4_ | (uint)!bVar11 * auVar157._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 2) & 1);
            auVar182._8_4_ = (float)((uint)bVar11 * auVar158._8_4_ | (uint)!bVar11 * auVar157._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 3) & 1);
            auVar182._12_4_ =
                 (float)((uint)bVar11 * auVar158._12_4_ | (uint)!bVar11 * auVar157._12_4_);
            auVar48._8_4_ = 0x3f318000;
            auVar48._0_8_ = 0x3f3180003f318000;
            auVar48._12_4_ = 0x3f318000;
            auVar157 = vfmsub231ps_avx512vl(auVar176,auVar182,auVar48);
            auVar49._8_4_ = 0x395e8083;
            auVar49._0_8_ = 0x395e8083395e8083;
            auVar49._12_4_ = 0x395e8083;
            auVar176 = vfmsub231ps_avx512vl(auVar157,auVar182,auVar49);
            auVar240._0_4_ = auVar176._0_4_ * auVar176._0_4_;
            auVar240._4_4_ = auVar176._4_4_ * auVar176._4_4_;
            auVar240._8_4_ = auVar176._8_4_ * auVar176._8_4_;
            auVar240._12_4_ = auVar176._12_4_ * auVar176._12_4_;
            auVar276._8_4_ = 0x39506967;
            auVar276._0_8_ = 0x3950696739506967;
            auVar276._12_4_ = 0x39506967;
            auVar50._8_4_ = 0x3ab743ce;
            auVar50._0_8_ = 0x3ab743ce3ab743ce;
            auVar50._12_4_ = 0x3ab743ce;
            auVar157 = vfmadd213ps_avx512vl(auVar276,auVar176,auVar50);
            auVar51._8_4_ = 0x3c088908;
            auVar51._0_8_ = 0x3c0889083c088908;
            auVar51._12_4_ = 0x3c088908;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar176,auVar51);
            auVar52._8_4_ = 0x3d2aa9c1;
            auVar52._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar52._12_4_ = 0x3d2aa9c1;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar176,auVar52);
            auVar53._8_4_ = 0x3e2aaaaa;
            auVar53._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar53._12_4_ = 0x3e2aaaaa;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar176,auVar53);
            auVar157 = vfmadd213ps_fma(auVar157,auVar176,auVar285);
            auVar157 = vfmadd213ps_fma(auVar157,auVar240,auVar176);
            auVar226._0_4_ = auVar157._0_4_ + 1.0;
            auVar226._4_4_ = auVar157._4_4_ + 1.0;
            auVar226._8_4_ = auVar157._8_4_ + 1.0;
            auVar226._12_4_ = auVar157._12_4_ + 1.0;
            auVar241._0_4_ = (int)auVar182._0_4_;
            auVar241._4_4_ = (int)auVar182._4_4_;
            auVar241._8_4_ = (int)auVar182._8_4_;
            auVar241._12_4_ = (int)auVar182._12_4_;
            auVar157 = vpslld_avx(auVar241,0x17);
            auVar54._8_4_ = 0x3f800000;
            auVar54._0_8_ = 0x3f8000003f800000;
            auVar54._12_4_ = 0x3f800000;
            auVar157 = vpaddd_avx512vl(auVar157,auVar54);
            auVar176 = vfmadd213ps_fma(auVar157,auVar226,auVar290);
            auVar157 = vrcpps_avx(auVar176);
            auVar176 = vfmsub213ps_fma(auVar176,auVar157,auVar290);
            auVar157 = vfnmadd132ps_fma(auVar176,auVar157,auVar157);
            break;
          case 5:
            auVar295._8_4_ = 0x42b0c0a5;
            auVar295._0_8_ = 0x42b0c0a542b0c0a5;
            auVar295._12_4_ = 0x42b0c0a5;
            auVar157 = vminps_avx(auVar162,auVar295);
            auVar300._8_4_ = 0xc2b0c0a5;
            auVar300._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar300._12_4_ = 0xc2b0c0a5;
            auVar158 = vmaxps_avx(auVar157,auVar300);
            auVar308._8_4_ = 0x3fb8aa3b;
            auVar308._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar308._12_4_ = 0x3fb8aa3b;
            auVar304._8_4_ = 0x3f000000;
            auVar304._0_8_ = 0x3f0000003f000000;
            auVar304._12_4_ = 0x3f000000;
            auVar159 = vfmadd213ps_fma(auVar308,auVar158,auVar304);
            auVar272._0_4_ = (int)auVar159._0_4_;
            auVar272._4_4_ = (int)auVar159._4_4_;
            auVar272._8_4_ = (int)auVar159._8_4_;
            auVar272._12_4_ = (int)auVar159._12_4_;
            auVar157 = vcvtdq2ps_avx(auVar272);
            uVar153 = vcmpps_avx512vl(auVar159,auVar157,1);
            auVar312._8_4_ = 0x3f800000;
            auVar312._0_8_ = 0x3f8000003f800000;
            auVar312._12_4_ = 0x3f800000;
            auVar159 = vsubps_avx512vl(auVar157,auVar312);
            bVar11 = (bool)((byte)uVar153 & 1);
            auVar177._0_4_ = (float)((uint)bVar11 * auVar159._0_4_ | (uint)!bVar11 * auVar157._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 1) & 1);
            auVar177._4_4_ = (float)((uint)bVar11 * auVar159._4_4_ | (uint)!bVar11 * auVar157._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 2) & 1);
            auVar177._8_4_ = (float)((uint)bVar11 * auVar159._8_4_ | (uint)!bVar11 * auVar157._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 3) & 1);
            auVar177._12_4_ =
                 (float)((uint)bVar11 * auVar159._12_4_ | (uint)!bVar11 * auVar157._12_4_);
            auVar316._8_4_ = 0x3f318000;
            auVar316._0_8_ = 0x3f3180003f318000;
            auVar316._12_4_ = 0x3f318000;
            auVar157 = vfmsub231ps_fma(auVar158,auVar177,auVar316);
            auVar159 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar158 = vfnmsub231ps_avx512vl(auVar157,auVar177,auVar159);
            auVar258._0_4_ = auVar158._0_4_ * auVar158._0_4_;
            auVar258._4_4_ = auVar158._4_4_ * auVar158._4_4_;
            auVar258._8_4_ = auVar158._8_4_ * auVar158._8_4_;
            auVar258._12_4_ = auVar158._12_4_ * auVar158._12_4_;
            auVar320._8_4_ = 0x39506967;
            auVar320._0_8_ = 0x3950696739506967;
            auVar320._12_4_ = 0x39506967;
            auVar324._8_4_ = 0x3ab743ce;
            auVar324._0_8_ = 0x3ab743ce3ab743ce;
            auVar324._12_4_ = 0x3ab743ce;
            auVar157 = vfmadd213ps_fma(auVar320,auVar158,auVar324);
            auVar328._8_4_ = 0x3c088908;
            auVar328._0_8_ = 0x3c0889083c088908;
            auVar328._12_4_ = 0x3c088908;
            auVar157 = vfmadd213ps_fma(auVar157,auVar158,auVar328);
            auVar331._8_4_ = 0x3d2aa9c1;
            auVar331._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar331._12_4_ = 0x3d2aa9c1;
            auVar157 = vfmadd213ps_fma(auVar157,auVar158,auVar331);
            auVar160 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar158,auVar160);
            auVar157 = vfmadd213ps_fma(auVar157,auVar158,auVar304);
            auVar157 = vfmadd213ps_fma(auVar157,auVar258,auVar158);
            auVar237._0_4_ = auVar157._0_4_ + 1.0;
            auVar237._4_4_ = auVar157._4_4_ + 1.0;
            auVar237._8_4_ = auVar157._8_4_ + 1.0;
            auVar237._12_4_ = auVar157._12_4_ + 1.0;
            auVar259._0_4_ = (int)auVar177._0_4_;
            auVar259._4_4_ = (int)auVar177._4_4_;
            auVar259._8_4_ = (int)auVar177._8_4_;
            auVar259._12_4_ = (int)auVar177._12_4_;
            auVar157 = vpslld_avx(auVar259,0x17);
            auVar161 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar157 = vpaddd_avx512vl(auVar157,auVar161);
            auVar157 = vfmadd213ps_fma(auVar157,auVar237,auVar312);
            uVar153 = vcmpps_avx512vl(auVar157,auVar176,2);
            auVar165._8_4_ = 0x800000;
            auVar165._0_8_ = 0x80000000800000;
            auVar165._12_4_ = 0x800000;
            auVar157 = vmaxps_avx512vl(auVar157,auVar165);
            auVar158 = vpsrld_avx(auVar157,0x17);
            auVar273._8_4_ = 0x807fffff;
            auVar273._0_8_ = 0x807fffff807fffff;
            auVar273._12_4_ = 0x807fffff;
            auVar166._8_4_ = 0x3f000000;
            auVar166._0_8_ = 0x3f0000003f000000;
            auVar166._12_4_ = 0x3f000000;
            auVar157 = vpternlogd_avx512vl(auVar157,auVar273,auVar166,0xea);
            auVar167._8_4_ = 0x3f3504f3;
            auVar167._0_8_ = 0x3f3504f33f3504f3;
            auVar167._12_4_ = 0x3f3504f3;
            uVar136 = vcmpps_avx512vl(auVar157,auVar167,1);
            auVar33._8_4_ = 0xbf800000;
            auVar33._0_8_ = 0xbf800000bf800000;
            auVar33._12_4_ = 0xbf800000;
            auVar176 = vaddps_avx512vl(auVar157,auVar33);
            auVar157 = vaddps_avx512vl(auVar176,auVar157);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar178._0_4_ = (float)((uint)bVar11 * auVar157._0_4_ | (uint)!bVar11 * auVar176._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar178._4_4_ = (float)((uint)bVar11 * auVar157._4_4_ | (uint)!bVar11 * auVar176._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar178._8_4_ = (float)((uint)bVar11 * auVar157._8_4_ | (uint)!bVar11 * auVar176._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar178._12_4_ =
                 (float)((uint)bVar11 * auVar157._12_4_ | (uint)!bVar11 * auVar176._12_4_);
            auVar238._0_4_ = auVar178._0_4_ * auVar178._0_4_;
            auVar238._4_4_ = auVar178._4_4_ * auVar178._4_4_;
            auVar238._8_4_ = auVar178._8_4_ * auVar178._8_4_;
            auVar238._12_4_ = auVar178._12_4_ * auVar178._12_4_;
            auVar283._8_4_ = 0x3d9021bb;
            auVar283._0_8_ = 0x3d9021bb3d9021bb;
            auVar283._12_4_ = 0x3d9021bb;
            auVar34._8_4_ = 0xbdebd1b8;
            auVar34._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar34._12_4_ = 0xbdebd1b8;
            auVar157 = vfmadd213ps_avx512vl(auVar283,auVar178,auVar34);
            auVar35._8_4_ = 0x3def251a;
            auVar35._0_8_ = 0x3def251a3def251a;
            auVar35._12_4_ = 0x3def251a;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar35);
            auVar36._8_4_ = 0xbdfe5d4f;
            auVar36._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar36._12_4_ = 0xbdfe5d4f;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar36);
            auVar37._8_4_ = 0x3e11e9bf;
            auVar37._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar37._12_4_ = 0x3e11e9bf;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar37);
            auVar38._8_4_ = 0xbe2aae50;
            auVar38._0_8_ = 0xbe2aae50be2aae50;
            auVar38._12_4_ = 0xbe2aae50;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar38);
            auVar39._8_4_ = 0x3e4cceac;
            auVar39._0_8_ = 0x3e4cceac3e4cceac;
            auVar39._12_4_ = 0x3e4cceac;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar39);
            auVar40._8_4_ = 0xbe7ffffc;
            auVar40._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar40._12_4_ = 0xbe7ffffc;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar40);
            auVar41._8_4_ = 0x3eaaaaaa;
            auVar41._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar41._12_4_ = 0x3eaaaaaa;
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar178,auVar41);
            auVar284._0_4_ = auVar238._0_4_ * auVar178._0_4_ * auVar157._0_4_;
            auVar284._4_4_ = auVar238._4_4_ * auVar178._4_4_ * auVar157._4_4_;
            auVar284._8_4_ = auVar238._8_4_ * auVar178._8_4_ * auVar157._8_4_;
            auVar284._12_4_ = auVar238._12_4_ * auVar178._12_4_ * auVar157._12_4_;
            auVar42._8_4_ = 0xffffff82;
            auVar42._0_8_ = 0xffffff82ffffff82;
            auVar42._12_4_ = 0xffffff82;
            auVar157 = vpaddd_avx512vl(auVar158,auVar42);
            auVar157 = vcvtdq2ps_avx(auVar157);
            auVar176 = vsubps_avx512vl(auVar157,auVar312);
            bVar11 = (bool)((byte)uVar136 & 1);
            auVar179._0_4_ = (uint)bVar11 * auVar176._0_4_ | (uint)!bVar11 * auVar157._0_4_;
            bVar11 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar179._4_4_ = (uint)bVar11 * auVar176._4_4_ | (uint)!bVar11 * auVar157._4_4_;
            bVar11 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar179._8_4_ = (uint)bVar11 * auVar176._8_4_ | (uint)!bVar11 * auVar157._8_4_;
            bVar11 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar179._12_4_ = (uint)bVar11 * auVar176._12_4_ | (uint)!bVar11 * auVar157._12_4_;
            auVar157 = vfmadd231ps_avx512vl(auVar284,auVar179,auVar159);
            auVar157 = vfmsub231ps_fma(auVar157,auVar304,auVar238);
            auVar157 = vsubps_avx(auVar157,auVar178);
            auVar157 = vfnmadd231ps_fma(auVar157,auVar316,auVar179);
            auVar176 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar153 & 1);
            auVar180._0_4_ =
                 (uint)bVar11 * auVar176._0_4_ |
                 (uint)!bVar11 * (int)(auVar157._0_4_ + auVar157._0_4_);
            bVar11 = (bool)((byte)(uVar153 >> 1) & 1);
            auVar180._4_4_ =
                 (uint)bVar11 * auVar176._4_4_ |
                 (uint)!bVar11 * (int)(auVar157._4_4_ + auVar157._4_4_);
            bVar11 = (bool)((byte)(uVar153 >> 2) & 1);
            auVar180._8_4_ =
                 (uint)bVar11 * auVar176._8_4_ |
                 (uint)!bVar11 * (int)(auVar157._8_4_ + auVar157._8_4_);
            bVar11 = (bool)((byte)(uVar153 >> 3) & 1);
            auVar180._12_4_ =
                 (uint)bVar11 * auVar176._12_4_ |
                 (uint)!bVar11 * (int)(auVar157._12_4_ + auVar157._12_4_);
            auVar157 = vminps_avx(auVar180,auVar295);
            auVar176 = vmaxps_avx(auVar157,auVar300);
            auVar158 = vfmadd213ps_fma(auVar308,auVar176,auVar304);
            auVar274._0_4_ = (int)auVar158._0_4_;
            auVar274._4_4_ = (int)auVar158._4_4_;
            auVar274._8_4_ = (int)auVar158._8_4_;
            auVar274._12_4_ = (int)auVar158._12_4_;
            auVar157 = vcvtdq2ps_avx(auVar274);
            uVar153 = vcmpps_avx512vl(auVar158,auVar157,1);
            auVar158 = vsubps_avx512vl(auVar157,auVar312);
            bVar11 = (bool)((byte)uVar153 & 1);
            auVar181._0_4_ = (float)((uint)bVar11 * auVar158._0_4_ | (uint)!bVar11 * auVar157._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 1) & 1);
            auVar181._4_4_ = (float)((uint)bVar11 * auVar158._4_4_ | (uint)!bVar11 * auVar157._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 2) & 1);
            auVar181._8_4_ = (float)((uint)bVar11 * auVar158._8_4_ | (uint)!bVar11 * auVar157._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar153 >> 3) & 1);
            auVar181._12_4_ =
                 (float)((uint)bVar11 * auVar158._12_4_ | (uint)!bVar11 * auVar157._12_4_);
            auVar157 = vfmsub231ps_fma(auVar176,auVar181,auVar316);
            auVar176 = vfnmsub231ps_avx512vl(auVar157,auVar181,auVar159);
            auVar260._0_4_ = auVar176._0_4_ * auVar176._0_4_;
            auVar260._4_4_ = auVar176._4_4_ * auVar176._4_4_;
            auVar260._8_4_ = auVar176._8_4_ * auVar176._8_4_;
            auVar260._12_4_ = auVar176._12_4_ * auVar176._12_4_;
            auVar157 = vfmadd213ps_fma(auVar320,auVar176,auVar324);
            auVar157 = vfmadd213ps_fma(auVar157,auVar176,auVar328);
            auVar157 = vfmadd213ps_fma(auVar157,auVar176,auVar331);
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar176,auVar160);
            auVar157 = vfmadd213ps_fma(auVar157,auVar176,auVar304);
            auVar157 = vfmadd213ps_fma(auVar157,auVar260,auVar176);
            auVar261._0_4_ = auVar157._0_4_ + 1.0;
            auVar261._4_4_ = auVar157._4_4_ + 1.0;
            auVar261._8_4_ = auVar157._8_4_ + 1.0;
            auVar261._12_4_ = auVar157._12_4_ + 1.0;
            auVar239._0_4_ = (int)auVar181._0_4_;
            auVar239._4_4_ = (int)auVar181._4_4_;
            auVar239._8_4_ = (int)auVar181._8_4_;
            auVar239._12_4_ = (int)auVar181._12_4_;
            auVar157 = vpslld_avx(auVar239,0x17);
            auVar157 = vpaddd_avx512vl(auVar157,auVar161);
            auVar176 = vfmadd213ps_fma(auVar157,auVar261,auVar312);
            auVar157 = vrcpps_avx(auVar176);
            auVar275._0_4_ = auVar157._0_4_ + auVar157._0_4_;
            auVar275._4_4_ = auVar157._4_4_ + auVar157._4_4_;
            auVar275._8_4_ = auVar157._8_4_ + auVar157._8_4_;
            auVar275._12_4_ = auVar157._12_4_ + auVar157._12_4_;
            auVar43._8_4_ = 0x40000000;
            auVar43._0_8_ = 0x4000000040000000;
            auVar43._12_4_ = 0x40000000;
            auVar176 = vfmsub213ps_avx512vl(auVar176,auVar275,auVar43);
            auVar157 = vfnmadd213ps_fma(auVar176,auVar157,auVar275);
            auVar157 = vfmsub213ps_fma(auVar157,auVar162,auVar162);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar164._4_4_ = uVar1;
            auVar164._0_4_ = uVar1;
            auVar164._8_4_ = uVar1;
            auVar164._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar163._4_4_ = uVar1;
            auVar163._0_4_ = uVar1;
            auVar163._8_4_ = uVar1;
            auVar163._12_4_ = uVar1;
            auVar157 = vfmadd213ps_avx512vl(auVar164,auVar162,auVar163);
            auVar157 = vmaxps_avx(auVar157,auVar176);
            auVar168._8_4_ = 0x3f800000;
            auVar168._0_8_ = 0x3f8000003f800000;
            auVar168._12_4_ = 0x3f800000;
            auVar176 = vminps_avx512vl(auVar157,auVar168);
            auVar157._0_4_ = auVar176._0_4_ * auVar162._0_4_;
            auVar157._4_4_ = auVar176._4_4_ * auVar162._4_4_;
            auVar157._8_4_ = auVar176._8_4_ * auVar162._8_4_;
            auVar157._12_4_ = auVar176._12_4_ * auVar162._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_138._0_8_ * 4) = auVar157;
        local_178._0_8_ = local_178._0_8_ + 4;
        local_2d8 = local_2d8 + 4;
        local_2e8._0_8_ = local_2e8._0_8_ + 4;
        local_158._0_8_ = local_158._0_8_ + 4;
        uVar153 = local_198._0_8_ + 1;
      }
      for (lVar138 = (long)(int)(local_1b8._0_4_ + uVar135 * 4); pauVar146 = local_338,
          lVar138 < (int)uVar5; lVar138 = lVar138 + 1) {
        if (lVar8 == 0) {
          auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar207 = ZEXT464(*(uint *)(lVar8 + lVar138 * 4));
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar142 = (long)(this->weight_data_tm).w;
        pauVar143 = (undefined1 (*) [16])(lVar138 * lVar142 * sVar10 + (long)pvVar9);
        lVar145 = 0;
        auVar157 = ZEXT816(0) << 0x40;
        iVar149 = 0;
        pauVar137 = local_338;
        while( true ) {
          auVar208 = ZEXT1664(auVar157);
          local_218 = ZEXT1632(auVar157);
          if (iVar141 <= iVar149 + 7) break;
          auVar157 = vlddqu_avx(*pauVar143);
          auVar183 = vcvtph2ps_f16c(auVar157);
          auVar157 = vfmadd231ps_fma(local_218,auVar183,*pauVar137);
          pauVar137 = pauVar137 + 1;
          pauVar143 = pauVar143 + 1;
          iVar149 = iVar149 + 8;
          lVar145 = lVar145 + 8;
        }
        auVar157 = ZEXT816(0) << 0x40;
        for (; iVar149 + 3 < iVar141; iVar149 = iVar149 + 4) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)*pauVar143;
          auVar176 = vcvtph2ps_f16c(auVar4);
          auVar157 = vfmadd231ps_fma(auVar157,auVar176,*(undefined1 (*) [16])*pauVar137);
          pauVar137 = (undefined1 (*) [32])(*pauVar137 + 0x10);
          pauVar143 = (undefined1 (*) [16])(*pauVar143 + 8);
          lVar145 = lVar145 + 4;
        }
        local_238._0_16_ = auVar157;
        for (; (int)lVar145 < iVar141; lVar145 = lVar145 + 1) {
          local_1f8._0_4_ = *(undefined4 *)(*pauVar146 + lVar145 * 4);
          auVar209._0_4_ =
               float16_to_float32(*(unsigned_short *)
                                   ((long)pvVar9 + lVar145 * 2 + sVar10 * lVar138 * lVar142));
          auVar209._4_60_ = extraout_var_01;
          auVar157 = vfmadd231ss_fma(ZEXT416((uint)auVar207._0_4_),auVar209._0_16_,
                                     ZEXT416((uint)local_1f8._0_4_));
          auVar207 = ZEXT1664(auVar157);
          auVar208 = ZEXT3264(local_218);
          auVar157 = local_238._0_16_;
        }
        auVar227._0_4_ = auVar208._0_4_ + auVar157._0_4_ + auVar208._16_4_;
        auVar227._4_4_ = auVar208._4_4_ + auVar157._4_4_ + auVar208._20_4_;
        auVar227._8_4_ = auVar208._8_4_ + auVar157._8_4_ + auVar208._24_4_;
        auVar227._12_4_ = auVar208._12_4_ + auVar157._12_4_ + auVar208._28_4_;
        auVar157 = vhaddps_avx(auVar227,auVar227);
        auVar157 = vhaddps_avx(auVar157,auVar157);
        fVar251 = auVar157._0_4_ + auVar207._0_4_;
        auVar157 = ZEXT416((uint)fVar251);
        fVar223 = fVar251;
        switch(iVar134) {
        case 1:
          auVar157 = vmaxss_avx(auVar157,ZEXT416(0));
          fVar223 = auVar157._0_4_;
          break;
        case 2:
          uVar15 = vcmpss_avx512f(auVar157,ZEXT416(0),0xe);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar223 = (float)((uint)bVar11 * 0x3f800000 +
                           (uint)!bVar11 * **(int **)(&this->field_0xe8 + (long)p_Var6)) * fVar251;
          break;
        case 3:
          fVar251 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar157 = vmaxss_avx(auVar157,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          fVar223 = auVar157._0_4_;
          if (fVar251 < auVar157._0_4_) {
            fVar223 = fVar251;
          }
          break;
        case 4:
          auVar157 = vminss_avx(auVar157,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar59._8_4_ = 0x80000000;
          auVar59._0_8_ = 0x8000000080000000;
          auVar59._12_4_ = 0x80000000;
          auVar176 = vxorps_avx512vl(auVar157,auVar59);
          uVar15 = vcmpss_avx512f(auVar157,ZEXT416(0xc2b0c0a5),1);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar251 = expf((float)((uint)bVar11 * 0x42b0c0a5 + (uint)!bVar11 * auVar176._0_4_));
          fVar223 = 1.0 / (fVar251 + 1.0);
          break;
        case 5:
          fVar223 = expf(fVar251);
          fVar223 = logf(fVar223 + 1.0);
          fVar223 = tanhf(fVar223);
          fVar223 = fVar223 * fVar251;
          break;
        case 6:
          fVar2 = **(float **)(&this->field_0xe8 + (long)p_Var6);
          auVar58._8_4_ = 0x80000000;
          auVar58._0_8_ = 0x8000000080000000;
          auVar58._12_4_ = 0x80000000;
          auVar158 = ZEXT416((uint)(*(float **)(&this->field_0xe8 + (long)p_Var6))[1]);
          auVar176 = vxorps_avx512vl(auVar158,auVar58);
          fVar270 = auVar176._0_4_ / fVar2;
          fVar223 = 0.0;
          if ((fVar270 <= fVar251) && (fVar223 = fVar251, fVar251 <= fVar270 + 1.0 / fVar2)) {
            auVar157 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar157,auVar158);
            fVar223 = auVar157._0_4_ * fVar251;
          }
        }
        *(float *)((long)top_blob->data + lVar138 * 4) = fVar223;
      }
    }
    else if (iVar149 == 4) {
      uVar136 = 0;
      if (0 < (int)uVar5) {
        uVar136 = uVar153;
      }
      auVar176 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar158 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar271._8_4_ = 0x3f000000;
      auVar271._0_8_ = 0x3f0000003f000000;
      auVar271._12_4_ = 0x3f000000;
      auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar289._8_4_ = 0x3f800000;
      auVar289._0_8_ = 0x3f8000003f800000;
      auVar289._12_4_ = 0x3f800000;
      auVar294._8_4_ = 0x3f318000;
      auVar294._0_8_ = 0x3f3180003f318000;
      auVar294._12_4_ = 0x3f318000;
      auVar303._8_4_ = 0x39506967;
      auVar303._0_8_ = 0x3950696739506967;
      auVar303._12_4_ = 0x39506967;
      auVar307._8_4_ = 0x3ab743ce;
      auVar307._0_8_ = 0x3ab743ce3ab743ce;
      auVar307._12_4_ = 0x3ab743ce;
      auVar311._8_4_ = 0x3c088908;
      auVar311._0_8_ = 0x3c0889083c088908;
      auVar311._12_4_ = 0x3c088908;
      auVar315._8_4_ = 0x3d2aa9c1;
      auVar315._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar315._12_4_ = 0x3d2aa9c1;
      auVar319._8_4_ = 0x3e2aaaaa;
      auVar319._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar319._12_4_ = 0x3e2aaaaa;
      auVar323._8_4_ = 0x3f800000;
      auVar323._0_8_ = 0x3f8000003f800000;
      auVar323._12_4_ = 0x3f800000;
      auVar327._8_4_ = 0xb95e8083;
      auVar327._0_8_ = 0xb95e8083b95e8083;
      auVar327._12_4_ = 0xb95e8083;
      auVar160 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar161 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar162 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar157 = vxorps_avx512vl(auVar157,auVar157);
      auVar163 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      for (uVar153 = 0; uVar153 != uVar136; uVar153 = uVar153 + 1) {
        if (lVar8 == 0) {
          auVar168 = ZEXT816(0) << 0x40;
        }
        else {
          auVar168 = *(undefined1 (*) [16])(lVar8 + uVar153 * 0x10);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar142 = (long)(this->weight_data_tm).w;
        pauVar137 = (undefined1 (*) [32])(uVar153 * lVar142 * sVar10 + (long)pvVar9);
        lVar138 = 0;
        auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar208 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar164 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar164);
        pauVar146 = local_338;
        for (iVar149 = 0; iVar149 + 7 < iVar141; iVar149 = iVar149 + 8) {
          auVar164 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar146));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 4)));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 8)));
          auVar167 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0xc)));
          auVar185 = vinsertf32x4_avx512vl(ZEXT1632(auVar164),auVar165,1);
          auVar186 = vinsertf32x4_avx512vl(ZEXT1632(auVar166),auVar167,1);
          auVar164 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x10)));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x14)));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x18)));
          auVar187 = vinsertf32x4_avx512vl(ZEXT1632(auVar164),auVar165,1);
          auVar164 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0x1c)));
          auVar188 = vinsertf32x4_avx512vl(ZEXT1632(auVar166),auVar164,1);
          auVar183 = vlddqu_avx(*pauVar137);
          auVar184 = vlddqu_avx(pauVar137[1]);
          auVar189 = vcvtph2ps_avx512vl(auVar183._0_16_);
          auVar183 = vcvtph2ps_f16c(auVar183._16_16_);
          auVar190 = vcvtph2ps_avx512vl(auVar184._0_16_);
          auVar184 = vcvtph2ps_f16c(auVar184._16_16_);
          auVar185 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar185,auVar189);
          in_ZMM17 = ZEXT3264(auVar185);
          auVar183 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar186,auVar183);
          in_ZMM16 = ZEXT3264(auVar183);
          auVar183 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar187,auVar190);
          auVar208 = ZEXT3264(auVar183);
          auVar183 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar188,auVar184);
          auVar207 = ZEXT3264(auVar183);
          pauVar146 = pauVar146 + 1;
          pauVar137 = pauVar137 + 2;
          lVar138 = lVar138 + 8;
        }
        while( true ) {
          if (iVar141 <= iVar149 + 3) break;
          uVar1 = *(undefined4 *)*pauVar146;
          auVar242._4_4_ = uVar1;
          auVar242._0_4_ = uVar1;
          auVar242._8_4_ = uVar1;
          auVar242._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar146 + 4);
          auVar242._20_4_ = uVar1;
          auVar242._16_4_ = uVar1;
          auVar242._24_4_ = uVar1;
          auVar242._28_4_ = uVar1;
          auVar164 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 8)));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar146 + 0xc)));
          auVar184 = vinsertf32x4_avx512vl(ZEXT1632(auVar164),auVar165,1);
          auVar183 = vlddqu_avx(*pauVar137);
          auVar185 = vcvtph2ps_avx512vl(auVar183._0_16_);
          auVar183 = vcvtph2ps_f16c(auVar183._16_16_);
          auVar185 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar242,auVar185);
          in_ZMM17 = ZEXT3264(auVar185);
          auVar183 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar184,auVar183);
          in_ZMM16 = ZEXT3264(auVar183);
          pauVar146 = (undefined1 (*) [32])(*pauVar146 + 0x10);
          pauVar137 = pauVar137 + 1;
          iVar149 = iVar149 + 4;
          lVar138 = lVar138 + 4;
        }
        for (; (int)lVar138 < iVar141; lVar138 = lVar138 + 1) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)pvVar9 + lVar138 * 8 + sVar10 * uVar153 * lVar142);
          auVar164 = vcvtph2ps_f16c(auVar3);
          uVar1 = *(undefined4 *)(*local_338 + lVar138 * 4);
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          auVar168 = vfmadd231ps_avx512vl(auVar168,auVar164,auVar16);
        }
        auVar183 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
        fVar251 = auVar208._4_4_ + auVar207._4_4_ + auVar183._4_4_;
        auVar224._0_4_ =
             auVar208._16_4_ + auVar207._16_4_ + auVar183._16_4_ +
             auVar208._0_4_ + auVar207._0_4_ + auVar183._0_4_ + auVar168._0_4_;
        auVar224._4_4_ = fVar251 + fVar251 + auVar168._4_4_;
        auVar224._8_4_ =
             auVar208._24_4_ + auVar207._24_4_ + auVar183._24_4_ +
             auVar208._8_4_ + auVar207._8_4_ + auVar183._8_4_ + auVar168._8_4_;
        auVar224._12_4_ =
             auVar208._28_4_ + auVar207._28_4_ + auVar183._28_4_ +
             auVar208._12_4_ + auVar207._12_4_ + auVar183._12_4_ + auVar168._12_4_;
        auVar169 = auVar224;
        if (iVar134 - 1U < 6) {
          auVar169 = vmaxps_avx512vl(auVar224,auVar157);
          switch(iVar134) {
          case 2:
            auVar168 = vminps_avx512vl(auVar224,auVar157);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar32._4_4_ = uVar1;
            auVar32._0_4_ = uVar1;
            auVar32._8_4_ = uVar1;
            auVar32._12_4_ = uVar1;
            auVar169 = vfmadd231ps_avx512vl(auVar169,auVar168,auVar32);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar30._4_4_ = uVar1;
            auVar30._0_4_ = uVar1;
            auVar30._8_4_ = uVar1;
            auVar30._12_4_ = uVar1;
            auVar168 = vmaxps_avx512vl(auVar224,auVar30);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar31._4_4_ = uVar1;
            auVar31._0_4_ = uVar1;
            auVar31._8_4_ = uVar1;
            auVar31._12_4_ = uVar1;
            auVar169 = vminps_avx512vl(auVar168,auVar31);
            break;
          case 4:
            auVar28._8_4_ = 0x80000000;
            auVar28._0_8_ = 0x8000000080000000;
            auVar28._12_4_ = 0x80000000;
            auVar168 = vxorps_avx512vl(auVar224,auVar28);
            auVar168 = vminps_avx512vl(auVar168,auVar176);
            auVar164 = vmaxps_avx512vl(auVar168,auVar158);
            auVar165 = vfmadd231ps_avx512vl(auVar271,auVar164,auVar159);
            auVar257._0_4_ = (int)auVar165._0_4_;
            auVar257._4_4_ = (int)auVar165._4_4_;
            auVar257._8_4_ = (int)auVar165._8_4_;
            auVar257._12_4_ = (int)auVar165._12_4_;
            auVar168 = vcvtdq2ps_avx(auVar257);
            uVar13 = vcmpps_avx512vl(auVar165,auVar168,1);
            auVar165 = vsubps_avx512vl(auVar168,auVar289);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar175._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar168._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar175._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar168._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar175._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar168._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar175._12_4_ =
                 (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar168._12_4_);
            auVar168 = vfmsub231ps_fma(auVar164,auVar175,auVar294);
            auVar29._8_4_ = 0x395e8083;
            auVar29._0_8_ = 0x395e8083395e8083;
            auVar29._12_4_ = 0x395e8083;
            auVar164 = vfmsub231ps_avx512vl(auVar168,auVar175,auVar29);
            auVar234._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar234._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar234._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar234._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar168 = vfmadd213ps_fma(auVar303,auVar164,auVar307);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar311);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar315);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar319);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar271);
            auVar168 = vfmadd213ps_fma(auVar168,auVar234,auVar164);
            auVar225._0_4_ = auVar168._0_4_ + 1.0;
            auVar225._4_4_ = auVar168._4_4_ + 1.0;
            auVar225._8_4_ = auVar168._8_4_ + 1.0;
            auVar225._12_4_ = auVar168._12_4_ + 1.0;
            auVar235._0_4_ = (int)auVar175._0_4_;
            auVar235._4_4_ = (int)auVar175._4_4_;
            auVar235._8_4_ = (int)auVar175._8_4_;
            auVar235._12_4_ = (int)auVar175._12_4_;
            auVar168 = vpslld_avx(auVar235,0x17);
            auVar168 = vpaddd_avx(auVar323,auVar168);
            auVar164 = vfmadd213ps_fma(auVar168,auVar225,auVar289);
            auVar168 = vrcpps_avx(auVar164);
            auVar164 = vfmsub213ps_fma(auVar164,auVar168,auVar289);
            auVar169 = vfnmadd132ps_fma(auVar164,auVar168,auVar168);
            break;
          case 5:
            auVar168 = vminps_avx512vl(auVar224,auVar176);
            auVar165 = vmaxps_avx512vl(auVar168,auVar158);
            auVar164 = vfmadd213ps_fma(auVar159,auVar165,auVar271);
            auVar280._0_4_ = (int)auVar164._0_4_;
            auVar280._4_4_ = (int)auVar164._4_4_;
            auVar280._8_4_ = (int)auVar164._8_4_;
            auVar280._12_4_ = (int)auVar164._12_4_;
            auVar168 = vcvtdq2ps_avx(auVar280);
            uVar13 = vcmpps_avx512vl(auVar164,auVar168,1);
            auVar164 = vsubps_avx512vl(auVar168,auVar289);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar170._0_4_ = (float)((uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar168._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar170._4_4_ = (float)((uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar168._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar170._8_4_ = (float)((uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar168._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar170._12_4_ =
                 (float)((uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar168._12_4_);
            auVar168 = vfmsub231ps_fma(auVar165,auVar170,auVar294);
            auVar164 = vfnmsub231ps_fma(auVar168,auVar170,auVar327);
            auVar252._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar252._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar252._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar252._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar168 = vfmadd213ps_fma(auVar303,auVar164,auVar307);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar311);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar315);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar319);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar271);
            auVar168 = vfmadd213ps_fma(auVar168,auVar252,auVar164);
            auVar231._0_4_ = auVar168._0_4_ + 1.0;
            auVar231._4_4_ = auVar168._4_4_ + 1.0;
            auVar231._8_4_ = auVar168._8_4_ + 1.0;
            auVar231._12_4_ = auVar168._12_4_ + 1.0;
            auVar253._0_4_ = (int)auVar170._0_4_;
            auVar253._4_4_ = (int)auVar170._4_4_;
            auVar253._8_4_ = (int)auVar170._8_4_;
            auVar253._12_4_ = (int)auVar170._12_4_;
            auVar168 = vpslld_avx(auVar253,0x17);
            auVar168 = vpaddd_avx(auVar323,auVar168);
            auVar168 = vfmadd213ps_fma(auVar168,auVar231,auVar289);
            uVar13 = vcmpps_avx512vl(auVar168,auVar157,2);
            auVar18._8_4_ = 0x800000;
            auVar18._0_8_ = 0x80000000800000;
            auVar18._12_4_ = 0x800000;
            auVar168 = vmaxps_avx512vl(auVar168,auVar18);
            auVar165 = vpsrld_avx(auVar168,0x17);
            auVar281._8_4_ = 0x807fffff;
            auVar281._0_8_ = 0x807fffff807fffff;
            auVar281._12_4_ = 0x807fffff;
            auVar19._8_4_ = 0x3f000000;
            auVar19._0_8_ = 0x3f0000003f000000;
            auVar19._12_4_ = 0x3f000000;
            auVar168 = vpternlogd_avx512vl(auVar168,auVar281,auVar19,0xea);
            auVar20._8_4_ = 0x3f3504f3;
            auVar20._0_8_ = 0x3f3504f33f3504f3;
            auVar20._12_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar168,auVar20,1);
            auVar21._8_4_ = 0xbf800000;
            auVar21._0_8_ = 0xbf800000bf800000;
            auVar21._12_4_ = 0xbf800000;
            auVar164 = vaddps_avx512vl(auVar168,auVar21);
            auVar168 = vaddps_avx512vl(auVar164,auVar168);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar171._0_4_ = (float)((uint)bVar11 * auVar168._0_4_ | (uint)!bVar11 * auVar164._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar171._4_4_ = (float)((uint)bVar11 * auVar168._4_4_ | (uint)!bVar11 * auVar164._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar171._8_4_ = (float)((uint)bVar11 * auVar168._8_4_ | (uint)!bVar11 * auVar164._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar171._12_4_ =
                 (float)((uint)bVar11 * auVar168._12_4_ | (uint)!bVar11 * auVar164._12_4_);
            auVar232._0_4_ = auVar171._0_4_ * auVar171._0_4_;
            auVar232._4_4_ = auVar171._4_4_ * auVar171._4_4_;
            auVar232._8_4_ = auVar171._8_4_ * auVar171._8_4_;
            auVar232._12_4_ = auVar171._12_4_ * auVar171._12_4_;
            auVar298._8_4_ = 0x3d9021bb;
            auVar298._0_8_ = 0x3d9021bb3d9021bb;
            auVar298._12_4_ = 0x3d9021bb;
            auVar22._8_4_ = 0xbdebd1b8;
            auVar22._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar22._12_4_ = 0xbdebd1b8;
            auVar168 = vfmadd213ps_avx512vl(auVar298,auVar171,auVar22);
            auVar23._8_4_ = 0x3def251a;
            auVar23._0_8_ = 0x3def251a3def251a;
            auVar23._12_4_ = 0x3def251a;
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar23);
            auVar24._8_4_ = 0xbdfe5d4f;
            auVar24._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar24._12_4_ = 0xbdfe5d4f;
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar24);
            auVar25._8_4_ = 0x3e11e9bf;
            auVar25._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar25._12_4_ = 0x3e11e9bf;
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar25);
            auVar26._8_4_ = 0xbe2aae50;
            auVar26._0_8_ = 0xbe2aae50be2aae50;
            auVar26._12_4_ = 0xbe2aae50;
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar26);
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar160);
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar161);
            auVar168 = vfmadd213ps_avx512vl(auVar168,auVar171,auVar162);
            auVar299._0_4_ = auVar232._0_4_ * auVar171._0_4_ * auVar168._0_4_;
            auVar299._4_4_ = auVar232._4_4_ * auVar171._4_4_ * auVar168._4_4_;
            auVar299._8_4_ = auVar232._8_4_ * auVar171._8_4_ * auVar168._8_4_;
            auVar299._12_4_ = auVar232._12_4_ * auVar171._12_4_ * auVar168._12_4_;
            auVar27._8_4_ = 0xffffff82;
            auVar27._0_8_ = 0xffffff82ffffff82;
            auVar27._12_4_ = 0xffffff82;
            auVar168 = vpaddd_avx512vl(auVar165,auVar27);
            auVar168 = vcvtdq2ps_avx(auVar168);
            auVar164 = vsubps_avx512vl(auVar168,auVar289);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar172._0_4_ = (uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar168._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar172._4_4_ = (uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar168._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar172._8_4_ = (uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar168._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar172._12_4_ = (uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar168._12_4_;
            auVar168 = vfmadd231ps_fma(auVar299,auVar172,auVar327);
            auVar168 = vfmsub231ps_fma(auVar168,auVar271,auVar232);
            auVar168 = vsubps_avx(auVar168,auVar171);
            auVar168 = vfnmadd231ps_fma(auVar168,auVar294,auVar172);
            auVar164 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar173._0_4_ =
                 (uint)bVar11 * auVar164._0_4_ |
                 (uint)!bVar11 * (int)(auVar168._0_4_ + auVar168._0_4_);
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar173._4_4_ =
                 (uint)bVar11 * auVar164._4_4_ |
                 (uint)!bVar11 * (int)(auVar168._4_4_ + auVar168._4_4_);
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar173._8_4_ =
                 (uint)bVar11 * auVar164._8_4_ |
                 (uint)!bVar11 * (int)(auVar168._8_4_ + auVar168._8_4_);
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar173._12_4_ =
                 (uint)bVar11 * auVar164._12_4_ |
                 (uint)!bVar11 * (int)(auVar168._12_4_ + auVar168._12_4_);
            auVar168 = vminps_avx512vl(auVar173,auVar176);
            auVar165 = vmaxps_avx512vl(auVar168,auVar158);
            auVar164 = vfmadd213ps_fma(auVar159,auVar165,auVar271);
            auVar282._0_4_ = (int)auVar164._0_4_;
            auVar282._4_4_ = (int)auVar164._4_4_;
            auVar282._8_4_ = (int)auVar164._8_4_;
            auVar282._12_4_ = (int)auVar164._12_4_;
            auVar168 = vcvtdq2ps_avx(auVar282);
            uVar13 = vcmpps_avx512vl(auVar164,auVar168,1);
            auVar164 = vsubps_avx512vl(auVar168,auVar289);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar174._0_4_ = (float)((uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar168._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar174._4_4_ = (float)((uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar168._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar174._8_4_ = (float)((uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar168._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar174._12_4_ =
                 (float)((uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar168._12_4_);
            auVar168 = vfmsub231ps_fma(auVar165,auVar174,auVar294);
            auVar164 = vfnmsub231ps_fma(auVar168,auVar174,auVar327);
            auVar254._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar254._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar254._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar254._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar168 = vfmadd213ps_fma(auVar303,auVar164,auVar307);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar311);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar315);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar319);
            auVar168 = vfmadd213ps_fma(auVar168,auVar164,auVar271);
            auVar168 = vfmadd213ps_fma(auVar168,auVar254,auVar164);
            auVar233._0_4_ = auVar168._0_4_ + 1.0;
            auVar233._4_4_ = auVar168._4_4_ + 1.0;
            auVar233._8_4_ = auVar168._8_4_ + 1.0;
            auVar233._12_4_ = auVar168._12_4_ + 1.0;
            auVar255._0_4_ = (int)auVar174._0_4_;
            auVar255._4_4_ = (int)auVar174._4_4_;
            auVar255._8_4_ = (int)auVar174._8_4_;
            auVar255._12_4_ = (int)auVar174._12_4_;
            auVar168 = vpslld_avx(auVar255,0x17);
            auVar168 = vpaddd_avx(auVar323,auVar168);
            auVar164 = vfmadd213ps_fma(auVar168,auVar233,auVar289);
            auVar168 = vrcpps_avx(auVar164);
            auVar256._0_4_ = auVar168._0_4_ + auVar168._0_4_;
            auVar256._4_4_ = auVar168._4_4_ + auVar168._4_4_;
            auVar256._8_4_ = auVar168._8_4_ + auVar168._8_4_;
            auVar256._12_4_ = auVar168._12_4_ + auVar168._12_4_;
            auVar164 = vfmsub213ps_avx512vl(auVar164,auVar256,auVar163);
            auVar168 = vfnmadd213ps_fma(auVar164,auVar168,auVar256);
            auVar169 = vfmsub213ps_fma(auVar168,auVar224,auVar224);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar236._4_4_ = uVar1;
            auVar236._0_4_ = uVar1;
            auVar236._8_4_ = uVar1;
            auVar236._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar17._4_4_ = uVar1;
            auVar17._0_4_ = uVar1;
            auVar17._8_4_ = uVar1;
            auVar17._12_4_ = uVar1;
            auVar168 = vfmadd213ps_avx512vl(auVar236,auVar224,auVar17);
            auVar168 = vmaxps_avx512vl(auVar168,auVar157);
            auVar168 = vminps_avx(auVar168,auVar289);
            auVar169._0_4_ = auVar168._0_4_ * auVar224._0_4_;
            auVar169._4_4_ = auVar168._4_4_ * auVar224._4_4_;
            auVar169._8_4_ = auVar168._8_4_ * auVar224._8_4_;
            auVar169._12_4_ = auVar168._12_4_ * auVar224._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar153 * 0x10) = auVar169;
      }
    }
    else if (iVar149 == 8) {
      if ((int)uVar5 < 1) {
        uVar153 = 0;
      }
      auVar183 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar184 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar277._8_4_ = 0x3f000000;
      auVar277._0_8_ = 0x3f0000003f000000;
      auVar277._12_4_ = 0x3f000000;
      auVar277._16_4_ = 0x3f000000;
      auVar277._20_4_ = 0x3f000000;
      auVar277._24_4_ = 0x3f000000;
      auVar277._28_4_ = 0x3f000000;
      auVar286._8_4_ = 0x3fb8aa3b;
      auVar286._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar286._12_4_ = 0x3fb8aa3b;
      auVar286._16_4_ = 0x3fb8aa3b;
      auVar286._20_4_ = 0x3fb8aa3b;
      auVar286._24_4_ = 0x3fb8aa3b;
      auVar286._28_4_ = 0x3fb8aa3b;
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = 0x3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar296._8_4_ = 0x3f318000;
      auVar296._0_8_ = 0x3f3180003f318000;
      auVar296._12_4_ = 0x3f318000;
      auVar296._16_4_ = 0x3f318000;
      auVar296._20_4_ = 0x3f318000;
      auVar296._24_4_ = 0x3f318000;
      auVar296._28_4_ = 0x3f318000;
      auVar305._8_4_ = 0x39506967;
      auVar305._0_8_ = 0x3950696739506967;
      auVar305._12_4_ = 0x39506967;
      auVar305._16_4_ = 0x39506967;
      auVar305._20_4_ = 0x39506967;
      auVar305._24_4_ = 0x39506967;
      auVar305._28_4_ = 0x39506967;
      auVar309._8_4_ = 0x3ab743ce;
      auVar309._0_8_ = 0x3ab743ce3ab743ce;
      auVar309._12_4_ = 0x3ab743ce;
      auVar309._16_4_ = 0x3ab743ce;
      auVar309._20_4_ = 0x3ab743ce;
      auVar309._24_4_ = 0x3ab743ce;
      auVar309._28_4_ = 0x3ab743ce;
      auVar313._8_4_ = 0x3c088908;
      auVar313._0_8_ = 0x3c0889083c088908;
      auVar313._12_4_ = 0x3c088908;
      auVar313._16_4_ = 0x3c088908;
      auVar313._20_4_ = 0x3c088908;
      auVar313._24_4_ = 0x3c088908;
      auVar313._28_4_ = 0x3c088908;
      auVar317._8_4_ = 0x3d2aa9c1;
      auVar317._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar317._12_4_ = 0x3d2aa9c1;
      auVar317._16_4_ = 0x3d2aa9c1;
      auVar317._20_4_ = 0x3d2aa9c1;
      auVar317._24_4_ = 0x3d2aa9c1;
      auVar317._28_4_ = 0x3d2aa9c1;
      auVar321._8_4_ = 0x3e2aaaaa;
      auVar321._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar321._12_4_ = 0x3e2aaaaa;
      auVar321._16_4_ = 0x3e2aaaaa;
      auVar321._20_4_ = 0x3e2aaaaa;
      auVar321._24_4_ = 0x3e2aaaaa;
      auVar321._28_4_ = 0x3e2aaaaa;
      auVar325._8_4_ = 0x3f800000;
      auVar325._0_8_ = 0x3f8000003f800000;
      auVar325._12_4_ = 0x3f800000;
      auVar325._16_4_ = 0x3f800000;
      auVar325._20_4_ = 0x3f800000;
      auVar325._24_4_ = 0x3f800000;
      auVar325._28_4_ = 0x3f800000;
      auVar329._8_4_ = 0xb95e8083;
      auVar329._0_8_ = 0xb95e8083b95e8083;
      auVar329._12_4_ = 0xb95e8083;
      auVar329._16_4_ = 0xb95e8083;
      auVar329._20_4_ = 0xb95e8083;
      auVar329._24_4_ = 0xb95e8083;
      auVar329._28_4_ = 0xb95e8083;
      auVar185 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar186 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar187 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar188 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar157 = vxorps_avx512vl(auVar157,auVar157);
      auVar190 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      for (uVar136 = 0; uVar136 != uVar153; uVar136 = uVar136 + 1) {
        auVar208 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar207 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar136 * 0x20));
        }
        pauVar137 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar136 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        lVar138 = 0;
        auVar209 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar176 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar176);
        auVar176 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar176);
        auVar176 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar176);
        auVar176 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar176);
        auVar176 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar176);
        iVar149 = 0;
        pauVar146 = local_338;
        while( true ) {
          if (iVar141 <= iVar149 + 7) break;
          auVar193 = vlddqu_avx(*pauVar137);
          auVar194 = vlddqu_avx(pauVar137[1]);
          auVar191 = vcvtph2ps_avx512vl(auVar193._0_16_);
          auVar193 = vcvtph2ps_f16c(auVar193._16_16_);
          auVar192 = vcvtph2ps_avx512vl(auVar194._0_16_);
          auVar194 = vcvtph2ps_f16c(auVar194._16_16_);
          uVar1 = *(undefined4 *)*pauVar146;
          auVar60._4_4_ = uVar1;
          auVar60._0_4_ = uVar1;
          auVar60._8_4_ = uVar1;
          auVar60._12_4_ = uVar1;
          auVar60._16_4_ = uVar1;
          auVar60._20_4_ = uVar1;
          auVar60._24_4_ = uVar1;
          auVar60._28_4_ = uVar1;
          auVar191 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar191,auVar60);
          auVar207 = ZEXT3264(auVar191);
          uVar1 = *(undefined4 *)(*pauVar146 + 4);
          auVar61._4_4_ = uVar1;
          auVar61._0_4_ = uVar1;
          auVar61._8_4_ = uVar1;
          auVar61._12_4_ = uVar1;
          auVar61._16_4_ = uVar1;
          auVar61._20_4_ = uVar1;
          auVar61._24_4_ = uVar1;
          auVar61._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM22._0_32_,auVar193,auVar61);
          in_ZMM22 = ZEXT3264(auVar193);
          uVar1 = *(undefined4 *)(*pauVar146 + 8);
          auVar62._4_4_ = uVar1;
          auVar62._0_4_ = uVar1;
          auVar62._8_4_ = uVar1;
          auVar62._12_4_ = uVar1;
          auVar62._16_4_ = uVar1;
          auVar62._20_4_ = uVar1;
          auVar62._24_4_ = uVar1;
          auVar62._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar192,auVar62);
          in_ZMM19 = ZEXT3264(auVar193);
          uVar1 = *(undefined4 *)(*pauVar146 + 0xc);
          auVar63._4_4_ = uVar1;
          auVar63._0_4_ = uVar1;
          auVar63._8_4_ = uVar1;
          auVar63._12_4_ = uVar1;
          auVar63._16_4_ = uVar1;
          auVar63._20_4_ = uVar1;
          auVar63._24_4_ = uVar1;
          auVar63._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar194,auVar63);
          in_ZMM17 = ZEXT3264(auVar193);
          auVar193 = vlddqu_avx(pauVar137[2]);
          auVar194 = vlddqu_avx(pauVar137[3]);
          auVar191 = vcvtph2ps_avx512vl(auVar193._0_16_);
          auVar193 = vcvtph2ps_f16c(auVar193._16_16_);
          auVar192 = vcvtph2ps_avx512vl(auVar194._0_16_);
          auVar194 = vcvtph2ps_f16c(auVar194._16_16_);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x10);
          auVar64._4_4_ = uVar1;
          auVar64._0_4_ = uVar1;
          auVar64._8_4_ = uVar1;
          auVar64._12_4_ = uVar1;
          auVar64._16_4_ = uVar1;
          auVar64._20_4_ = uVar1;
          auVar64._24_4_ = uVar1;
          auVar64._28_4_ = uVar1;
          auVar191 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar191,auVar64);
          in_ZMM18 = ZEXT3264(auVar191);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x14);
          auVar65._4_4_ = uVar1;
          auVar65._0_4_ = uVar1;
          auVar65._8_4_ = uVar1;
          auVar65._12_4_ = uVar1;
          auVar65._16_4_ = uVar1;
          auVar65._20_4_ = uVar1;
          auVar65._24_4_ = uVar1;
          auVar65._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar193,auVar65);
          in_ZMM16 = ZEXT3264(auVar193);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x18);
          auVar66._4_4_ = uVar1;
          auVar66._0_4_ = uVar1;
          auVar66._8_4_ = uVar1;
          auVar66._12_4_ = uVar1;
          auVar66._16_4_ = uVar1;
          auVar66._20_4_ = uVar1;
          auVar66._24_4_ = uVar1;
          auVar66._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar192,auVar66);
          auVar209 = ZEXT3264(auVar193);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x1c);
          auVar67._4_4_ = uVar1;
          auVar67._0_4_ = uVar1;
          auVar67._8_4_ = uVar1;
          auVar67._12_4_ = uVar1;
          auVar67._16_4_ = uVar1;
          auVar67._20_4_ = uVar1;
          auVar67._24_4_ = uVar1;
          auVar67._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar194,auVar67);
          auVar208 = ZEXT3264(auVar193);
          pauVar146 = pauVar146 + 1;
          pauVar137 = pauVar137 + 4;
          iVar149 = iVar149 + 8;
          lVar138 = lVar138 + 8;
        }
        while( true ) {
          if (iVar141 <= iVar149 + 3) break;
          auVar193 = vlddqu_avx(*pauVar137);
          auVar194 = vlddqu_avx(pauVar137[1]);
          auVar191 = vcvtph2ps_avx512vl(auVar193._0_16_);
          auVar193 = vcvtph2ps_f16c(auVar193._16_16_);
          auVar192 = vcvtph2ps_avx512vl(auVar194._0_16_);
          auVar194 = vcvtph2ps_f16c(auVar194._16_16_);
          uVar1 = *(undefined4 *)*pauVar146;
          auVar69._4_4_ = uVar1;
          auVar69._0_4_ = uVar1;
          auVar69._8_4_ = uVar1;
          auVar69._12_4_ = uVar1;
          auVar69._16_4_ = uVar1;
          auVar69._20_4_ = uVar1;
          auVar69._24_4_ = uVar1;
          auVar69._28_4_ = uVar1;
          auVar191 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar191,auVar69);
          auVar207 = ZEXT3264(auVar191);
          uVar1 = *(undefined4 *)(*pauVar146 + 4);
          auVar70._4_4_ = uVar1;
          auVar70._0_4_ = uVar1;
          auVar70._8_4_ = uVar1;
          auVar70._12_4_ = uVar1;
          auVar70._16_4_ = uVar1;
          auVar70._20_4_ = uVar1;
          auVar70._24_4_ = uVar1;
          auVar70._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM22._0_32_,auVar193,auVar70);
          in_ZMM22 = ZEXT3264(auVar193);
          uVar1 = *(undefined4 *)(*pauVar146 + 8);
          auVar71._4_4_ = uVar1;
          auVar71._0_4_ = uVar1;
          auVar71._8_4_ = uVar1;
          auVar71._12_4_ = uVar1;
          auVar71._16_4_ = uVar1;
          auVar71._20_4_ = uVar1;
          auVar71._24_4_ = uVar1;
          auVar71._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar192,auVar71);
          in_ZMM19 = ZEXT3264(auVar193);
          uVar1 = *(undefined4 *)(*pauVar146 + 0xc);
          auVar72._4_4_ = uVar1;
          auVar72._0_4_ = uVar1;
          auVar72._8_4_ = uVar1;
          auVar72._12_4_ = uVar1;
          auVar72._16_4_ = uVar1;
          auVar72._20_4_ = uVar1;
          auVar72._24_4_ = uVar1;
          auVar72._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar194,auVar72);
          in_ZMM17 = ZEXT3264(auVar193);
          pauVar146 = (undefined1 (*) [32])(*pauVar146 + 0x10);
          pauVar137 = pauVar137 + 2;
          iVar149 = iVar149 + 4;
          lVar138 = lVar138 + 4;
        }
        for (; (int)lVar138 < iVar141; lVar138 = lVar138 + 1) {
          auVar176 = vlddqu_avx(*(undefined1 (*) [16])*pauVar137);
          auVar193 = vcvtph2ps_f16c(auVar176);
          uVar1 = *(undefined4 *)(*local_338 + lVar138 * 4);
          auVar68._4_4_ = uVar1;
          auVar68._0_4_ = uVar1;
          auVar68._8_4_ = uVar1;
          auVar68._12_4_ = uVar1;
          auVar68._16_4_ = uVar1;
          auVar68._20_4_ = uVar1;
          auVar68._24_4_ = uVar1;
          auVar68._28_4_ = uVar1;
          auVar193 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar193,auVar68);
          auVar207 = ZEXT3264(auVar193);
          pauVar137 = (undefined1 (*) [32])(*pauVar137 + 0x10);
        }
        auVar193 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM18._0_32_);
        auVar194 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM19._0_32_);
        auVar194 = vaddps_avx512vl(auVar194,in_ZMM22._0_32_);
        auVar228._0_4_ =
             auVar209._0_4_ + auVar208._0_4_ + auVar193._0_4_ + auVar194._0_4_ + auVar207._0_4_;
        auVar228._4_4_ =
             auVar209._4_4_ + auVar208._4_4_ + auVar193._4_4_ + auVar194._4_4_ + auVar207._4_4_;
        auVar228._8_4_ =
             auVar209._8_4_ + auVar208._8_4_ + auVar193._8_4_ + auVar194._8_4_ + auVar207._8_4_;
        auVar228._12_4_ =
             auVar209._12_4_ + auVar208._12_4_ + auVar193._12_4_ + auVar194._12_4_ + auVar207._12_4_
        ;
        auVar228._16_4_ =
             auVar209._16_4_ + auVar208._16_4_ + auVar193._16_4_ + auVar194._16_4_ + auVar207._16_4_
        ;
        auVar228._20_4_ =
             auVar209._20_4_ + auVar208._20_4_ + auVar193._20_4_ + auVar194._20_4_ + auVar207._20_4_
        ;
        auVar228._24_4_ =
             auVar209._24_4_ + auVar208._24_4_ + auVar193._24_4_ + auVar194._24_4_ + auVar207._24_4_
        ;
        auVar228._28_4_ =
             auVar209._28_4_ + auVar208._28_4_ + auVar193._28_4_ + auVar194._28_4_ + auVar207._28_4_
        ;
        auVar195 = auVar228;
        if (iVar134 - 1U < 6) {
          auVar195 = vmaxps_avx512vl(auVar228,ZEXT1632(auVar157));
          switch(iVar134) {
          case 2:
            auVar193 = vminps_avx512vl(auVar228,ZEXT1632(auVar157));
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar86._4_4_ = uVar1;
            auVar86._0_4_ = uVar1;
            auVar86._8_4_ = uVar1;
            auVar86._12_4_ = uVar1;
            auVar86._16_4_ = uVar1;
            auVar86._20_4_ = uVar1;
            auVar86._24_4_ = uVar1;
            auVar86._28_4_ = uVar1;
            auVar195 = vfmadd231ps_avx512vl(auVar195,auVar193,auVar86);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar84._4_4_ = uVar1;
            auVar84._0_4_ = uVar1;
            auVar84._8_4_ = uVar1;
            auVar84._12_4_ = uVar1;
            auVar84._16_4_ = uVar1;
            auVar84._20_4_ = uVar1;
            auVar84._24_4_ = uVar1;
            auVar84._28_4_ = uVar1;
            auVar193 = vmaxps_avx512vl(auVar228,auVar84);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar85._4_4_ = uVar1;
            auVar85._0_4_ = uVar1;
            auVar85._8_4_ = uVar1;
            auVar85._12_4_ = uVar1;
            auVar85._16_4_ = uVar1;
            auVar85._20_4_ = uVar1;
            auVar85._24_4_ = uVar1;
            auVar85._28_4_ = uVar1;
            auVar195 = vminps_avx512vl(auVar193,auVar85);
            break;
          case 4:
            auVar82._8_4_ = 0x80000000;
            auVar82._0_8_ = 0x8000000080000000;
            auVar82._12_4_ = 0x80000000;
            auVar82._16_4_ = 0x80000000;
            auVar82._20_4_ = 0x80000000;
            auVar82._24_4_ = 0x80000000;
            auVar82._28_4_ = 0x80000000;
            auVar193 = vxorps_avx512vl(auVar228,auVar82);
            auVar193 = vminps_avx512vl(auVar193,auVar183);
            auVar194 = vmaxps_avx512vl(auVar193,auVar184);
            auVar176 = vfmadd231ps_fma(auVar277,auVar194,auVar286);
            auVar193 = vroundps_avx(ZEXT1632(auVar176),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar176),auVar193,1);
            auVar191 = vsubps_avx512vl(auVar193,auVar291);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar201._0_4_ = (float)((uint)bVar11 * auVar191._0_4_ | (uint)!bVar11 * auVar193._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar201._4_4_ = (float)((uint)bVar11 * auVar191._4_4_ | (uint)!bVar11 * auVar193._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar201._8_4_ = (float)((uint)bVar11 * auVar191._8_4_ | (uint)!bVar11 * auVar193._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar201._12_4_ =
                 (float)((uint)bVar11 * auVar191._12_4_ | (uint)!bVar11 * auVar193._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar201._16_4_ =
                 (float)((uint)bVar11 * auVar191._16_4_ | (uint)!bVar11 * auVar193._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar201._20_4_ =
                 (float)((uint)bVar11 * auVar191._20_4_ | (uint)!bVar11 * auVar193._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar201._24_4_ =
                 (float)((uint)bVar11 * auVar191._24_4_ | (uint)!bVar11 * auVar193._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar201._28_4_ =
                 (float)((uint)bVar11 * auVar191._28_4_ | (uint)!bVar11 * auVar193._28_4_);
            auVar176 = vfmsub231ps_fma(auVar194,auVar201,auVar296);
            auVar83._8_4_ = 0x395e8083;
            auVar83._0_8_ = 0x395e8083395e8083;
            auVar83._12_4_ = 0x395e8083;
            auVar83._16_4_ = 0x395e8083;
            auVar83._20_4_ = 0x395e8083;
            auVar83._24_4_ = 0x395e8083;
            auVar83._28_4_ = 0x395e8083;
            auVar193 = vfmsub231ps_avx512vl(ZEXT1632(auVar176),auVar201,auVar83);
            auVar245._0_4_ = auVar193._0_4_ * auVar193._0_4_;
            auVar245._4_4_ = auVar193._4_4_ * auVar193._4_4_;
            auVar245._8_4_ = auVar193._8_4_ * auVar193._8_4_;
            auVar245._12_4_ = auVar193._12_4_ * auVar193._12_4_;
            auVar245._16_4_ = auVar193._16_4_ * auVar193._16_4_;
            auVar245._20_4_ = auVar193._20_4_ * auVar193._20_4_;
            auVar245._24_4_ = auVar193._24_4_ * auVar193._24_4_;
            auVar245._28_4_ = 0;
            auVar176 = vfmadd213ps_fma(auVar305,auVar193,auVar309);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar313);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar317);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar321);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar277);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar245,auVar193);
            auVar229._0_4_ = auVar176._0_4_ + 1.0;
            auVar229._4_4_ = auVar176._4_4_ + 1.0;
            auVar229._8_4_ = auVar176._8_4_ + 1.0;
            auVar229._12_4_ = auVar176._12_4_ + 1.0;
            auVar229._16_4_ = 0x3f800000;
            auVar229._20_4_ = 0x3f800000;
            auVar229._24_4_ = 0x3f800000;
            auVar229._28_4_ = 0x3f800000;
            auVar246._0_4_ = (int)auVar201._0_4_;
            auVar246._4_4_ = (int)auVar201._4_4_;
            auVar246._8_4_ = (int)auVar201._8_4_;
            auVar246._12_4_ = (int)auVar201._12_4_;
            auVar246._16_4_ = (int)auVar201._16_4_;
            auVar246._20_4_ = (int)auVar201._20_4_;
            auVar246._24_4_ = (int)auVar201._24_4_;
            auVar246._28_4_ = (int)auVar201._28_4_;
            auVar193 = vpslld_avx2(auVar246,0x17);
            auVar193 = vpaddd_avx2(auVar325,auVar193);
            auVar176 = vfmadd213ps_fma(auVar193,auVar229,auVar291);
            auVar193 = vrcpps_avx(ZEXT1632(auVar176));
            auVar176 = vfmsub213ps_fma(ZEXT1632(auVar176),auVar193,auVar291);
            auVar176 = vfnmadd132ps_fma(ZEXT1632(auVar176),auVar193,auVar193);
            auVar195 = ZEXT1632(auVar176);
            break;
          case 5:
            auVar193 = vminps_avx512vl(auVar228,auVar183);
            auVar194 = vmaxps_avx512vl(auVar193,auVar184);
            auVar176 = vfmadd213ps_fma(auVar286,auVar194,auVar277);
            auVar193 = vroundps_avx(ZEXT1632(auVar176),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar176),auVar193,1);
            auVar191 = vsubps_avx512vl(auVar193,auVar291);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar196._0_4_ = (float)((uint)bVar11 * auVar191._0_4_ | (uint)!bVar11 * auVar193._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar196._4_4_ = (float)((uint)bVar11 * auVar191._4_4_ | (uint)!bVar11 * auVar193._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar196._8_4_ = (float)((uint)bVar11 * auVar191._8_4_ | (uint)!bVar11 * auVar193._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar196._12_4_ =
                 (float)((uint)bVar11 * auVar191._12_4_ | (uint)!bVar11 * auVar193._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar196._16_4_ =
                 (float)((uint)bVar11 * auVar191._16_4_ | (uint)!bVar11 * auVar193._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar196._20_4_ =
                 (float)((uint)bVar11 * auVar191._20_4_ | (uint)!bVar11 * auVar193._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar196._24_4_ =
                 (float)((uint)bVar11 * auVar191._24_4_ | (uint)!bVar11 * auVar193._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar196._28_4_ =
                 (float)((uint)bVar11 * auVar191._28_4_ | (uint)!bVar11 * auVar193._28_4_);
            auVar176 = vfmsub231ps_fma(auVar194,auVar196,auVar296);
            auVar158 = vfnmsub231ps_fma(ZEXT1632(auVar176),auVar196,auVar329);
            auVar193 = ZEXT1632(auVar158);
            auVar176 = vfmadd213ps_fma(auVar305,auVar193,auVar309);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar313);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar317);
            auVar193 = ZEXT1632(auVar158);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar321);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar277);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),
                                       ZEXT1632(CONCAT412(auVar158._12_4_ * auVar158._12_4_,
                                                          CONCAT48(auVar158._8_4_ * auVar158._8_4_,
                                                                   CONCAT44(auVar158._4_4_ *
                                                                            auVar158._4_4_,
                                                                            auVar158._0_4_ *
                                                                            auVar158._0_4_)))),
                                       auVar193);
            auVar243._0_4_ = auVar176._0_4_ + 1.0;
            auVar243._4_4_ = auVar176._4_4_ + 1.0;
            auVar243._8_4_ = auVar176._8_4_ + 1.0;
            auVar243._12_4_ = auVar176._12_4_ + 1.0;
            auVar243._16_4_ = 0x3f800000;
            auVar243._20_4_ = 0x3f800000;
            auVar243._24_4_ = 0x3f800000;
            auVar243._28_4_ = 0x3f800000;
            auVar263._0_4_ = (int)auVar196._0_4_;
            auVar263._4_4_ = (int)auVar196._4_4_;
            auVar263._8_4_ = (int)auVar196._8_4_;
            auVar263._12_4_ = (int)auVar196._12_4_;
            auVar263._16_4_ = (int)auVar196._16_4_;
            auVar263._20_4_ = (int)auVar196._20_4_;
            auVar263._24_4_ = (int)auVar196._24_4_;
            auVar263._28_4_ = (int)auVar196._28_4_;
            auVar193 = vpslld_avx2(auVar263,0x17);
            auVar193 = vpaddd_avx2(auVar325,auVar193);
            auVar176 = vfmadd213ps_fma(auVar193,auVar243,auVar291);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar176),ZEXT1632(auVar157),2);
            auVar74._8_4_ = 0x800000;
            auVar74._0_8_ = 0x80000000800000;
            auVar74._12_4_ = 0x800000;
            auVar74._16_4_ = 0x800000;
            auVar74._20_4_ = 0x800000;
            auVar74._24_4_ = 0x800000;
            auVar74._28_4_ = 0x800000;
            auVar193 = vmaxps_avx512vl(ZEXT1632(auVar176),auVar74);
            auVar192 = vpsrld_avx2(auVar193,0x17);
            auVar301._8_4_ = 0x807fffff;
            auVar301._0_8_ = 0x807fffff807fffff;
            auVar301._12_4_ = 0x807fffff;
            auVar301._16_4_ = 0x807fffff;
            auVar301._20_4_ = 0x807fffff;
            auVar301._24_4_ = 0x807fffff;
            auVar301._28_4_ = 0x807fffff;
            auVar75._8_4_ = 0x3f000000;
            auVar75._0_8_ = 0x3f0000003f000000;
            auVar75._12_4_ = 0x3f000000;
            auVar75._16_4_ = 0x3f000000;
            auVar75._20_4_ = 0x3f000000;
            auVar75._24_4_ = 0x3f000000;
            auVar75._28_4_ = 0x3f000000;
            auVar193 = vpternlogd_avx512vl(auVar193,auVar301,auVar75,0xea);
            auVar76._8_4_ = 0x3f3504f3;
            auVar76._0_8_ = 0x3f3504f33f3504f3;
            auVar76._12_4_ = 0x3f3504f3;
            auVar76._16_4_ = 0x3f3504f3;
            auVar76._20_4_ = 0x3f3504f3;
            auVar76._24_4_ = 0x3f3504f3;
            auVar76._28_4_ = 0x3f3504f3;
            uVar14 = vcmpps_avx512vl(auVar193,auVar76,1);
            auVar194 = vaddps_avx512vl(auVar193,auVar185);
            auVar191 = vaddps_avx512vl(auVar194,auVar193);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar197._0_4_ = (float)((uint)bVar11 * auVar191._0_4_ | (uint)!bVar11 * auVar194._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar197._4_4_ = (float)((uint)bVar11 * auVar191._4_4_ | (uint)!bVar11 * auVar194._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar197._8_4_ = (float)((uint)bVar11 * auVar191._8_4_ | (uint)!bVar11 * auVar194._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar197._12_4_ =
                 (float)((uint)bVar11 * auVar191._12_4_ | (uint)!bVar11 * auVar194._12_4_);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar197._16_4_ =
                 (float)((uint)bVar11 * auVar191._16_4_ | (uint)!bVar11 * auVar194._16_4_);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar197._20_4_ =
                 (float)((uint)bVar11 * auVar191._20_4_ | (uint)!bVar11 * auVar194._20_4_);
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar197._24_4_ =
                 (float)((uint)bVar11 * auVar191._24_4_ | (uint)!bVar11 * auVar194._24_4_);
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar197._28_4_ = (uint)bVar11 * auVar191._28_4_ | (uint)!bVar11 * auVar194._28_4_;
            auVar118._4_4_ = auVar197._4_4_ * auVar197._4_4_;
            auVar118._0_4_ = auVar197._0_4_ * auVar197._0_4_;
            auVar118._8_4_ = auVar197._8_4_ * auVar197._8_4_;
            auVar118._12_4_ = auVar197._12_4_ * auVar197._12_4_;
            auVar118._16_4_ = auVar197._16_4_ * auVar197._16_4_;
            auVar118._20_4_ = auVar197._20_4_ * auVar197._20_4_;
            auVar118._24_4_ = auVar197._24_4_ * auVar197._24_4_;
            auVar118._28_4_ = auVar193._28_4_;
            auVar332._8_4_ = 0x3d9021bb;
            auVar332._0_8_ = 0x3d9021bb3d9021bb;
            auVar332._12_4_ = 0x3d9021bb;
            auVar332._16_4_ = 0x3d9021bb;
            auVar332._20_4_ = 0x3d9021bb;
            auVar332._24_4_ = 0x3d9021bb;
            auVar332._28_4_ = 0x3d9021bb;
            auVar77._8_4_ = 0xbdebd1b8;
            auVar77._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar77._12_4_ = 0xbdebd1b8;
            auVar77._16_4_ = 0xbdebd1b8;
            auVar77._20_4_ = 0xbdebd1b8;
            auVar77._24_4_ = 0xbdebd1b8;
            auVar77._28_4_ = 0xbdebd1b8;
            auVar193 = vfmadd213ps_avx512vl(auVar332,auVar197,auVar77);
            auVar78._8_4_ = 0x3def251a;
            auVar78._0_8_ = 0x3def251a3def251a;
            auVar78._12_4_ = 0x3def251a;
            auVar78._16_4_ = 0x3def251a;
            auVar78._20_4_ = 0x3def251a;
            auVar78._24_4_ = 0x3def251a;
            auVar78._28_4_ = 0x3def251a;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar78);
            auVar79._8_4_ = 0xbdfe5d4f;
            auVar79._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar79._12_4_ = 0xbdfe5d4f;
            auVar79._16_4_ = 0xbdfe5d4f;
            auVar79._20_4_ = 0xbdfe5d4f;
            auVar79._24_4_ = 0xbdfe5d4f;
            auVar79._28_4_ = 0xbdfe5d4f;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar79);
            auVar80._8_4_ = 0x3e11e9bf;
            auVar80._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar80._12_4_ = 0x3e11e9bf;
            auVar80._16_4_ = 0x3e11e9bf;
            auVar80._20_4_ = 0x3e11e9bf;
            auVar80._24_4_ = 0x3e11e9bf;
            auVar80._28_4_ = 0x3e11e9bf;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar80);
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar186);
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar187);
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar188);
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar197,auVar189);
            auVar194 = vmulps_avx512vl(auVar118,auVar197);
            in_ZMM16 = ZEXT3264(auVar194);
            auVar194 = vmulps_avx512vl(auVar194,auVar193);
            auVar81._8_4_ = 0xffffff82;
            auVar81._0_8_ = 0xffffff82ffffff82;
            auVar81._12_4_ = 0xffffff82;
            auVar81._16_4_ = 0xffffff82;
            auVar81._20_4_ = 0xffffff82;
            auVar81._24_4_ = 0xffffff82;
            auVar81._28_4_ = 0xffffff82;
            auVar193 = vpaddd_avx512vl(auVar192,auVar81);
            auVar193 = vcvtdq2ps_avx(auVar193);
            auVar191 = vsubps_avx512vl(auVar193,auVar291);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar198._0_4_ = (uint)bVar11 * auVar191._0_4_ | (uint)!bVar11 * auVar193._0_4_;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar198._4_4_ = (uint)bVar11 * auVar191._4_4_ | (uint)!bVar11 * auVar193._4_4_;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar198._8_4_ = (uint)bVar11 * auVar191._8_4_ | (uint)!bVar11 * auVar193._8_4_;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar198._12_4_ = (uint)bVar11 * auVar191._12_4_ | (uint)!bVar11 * auVar193._12_4_;
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar198._16_4_ = (uint)bVar11 * auVar191._16_4_ | (uint)!bVar11 * auVar193._16_4_;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar198._20_4_ = (uint)bVar11 * auVar191._20_4_ | (uint)!bVar11 * auVar193._20_4_;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar198._24_4_ = (uint)bVar11 * auVar191._24_4_ | (uint)!bVar11 * auVar193._24_4_;
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar198._28_4_ = (uint)bVar11 * auVar191._28_4_ | (uint)!bVar11 * auVar193._28_4_;
            auVar176 = vfmadd231ps_fma(auVar194,auVar198,auVar329);
            auVar176 = vfmsub231ps_fma(ZEXT1632(auVar176),auVar277,auVar118);
            auVar193 = vsubps_avx(ZEXT1632(auVar176),auVar197);
            auVar176 = vfmsub231ps_fma(auVar193,auVar296,auVar198);
            auVar193 = vmulps_avx512vl(ZEXT1632(auVar176),auVar190);
            auVar194 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar199._0_4_ = (uint)bVar11 * auVar194._0_4_ | (uint)!bVar11 * auVar193._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar199._4_4_ = (uint)bVar11 * auVar194._4_4_ | (uint)!bVar11 * auVar193._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar199._8_4_ = (uint)bVar11 * auVar194._8_4_ | (uint)!bVar11 * auVar193._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar199._12_4_ = (uint)bVar11 * auVar194._12_4_ | (uint)!bVar11 * auVar193._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar199._16_4_ = (uint)bVar11 * auVar194._16_4_ | (uint)!bVar11 * auVar193._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar199._20_4_ = (uint)bVar11 * auVar194._20_4_ | (uint)!bVar11 * auVar193._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar199._24_4_ = (uint)bVar11 * auVar194._24_4_ | (uint)!bVar11 * auVar193._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar199._28_4_ = (uint)bVar11 * auVar194._28_4_ | (uint)!bVar11 * auVar193._28_4_;
            auVar193 = vminps_avx512vl(auVar199,auVar183);
            auVar194 = vmaxps_avx512vl(auVar193,auVar184);
            auVar176 = vfmadd213ps_fma(auVar286,auVar194,auVar277);
            auVar193 = vroundps_avx(ZEXT1632(auVar176),1);
            uVar13 = vcmpps_avx512vl(ZEXT1632(auVar176),auVar193,1);
            auVar191 = vsubps_avx512vl(auVar193,auVar291);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar200._0_4_ = (float)((uint)bVar11 * auVar191._0_4_ | (uint)!bVar11 * auVar193._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar200._4_4_ = (float)((uint)bVar11 * auVar191._4_4_ | (uint)!bVar11 * auVar193._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar200._8_4_ = (float)((uint)bVar11 * auVar191._8_4_ | (uint)!bVar11 * auVar193._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar200._12_4_ =
                 (float)((uint)bVar11 * auVar191._12_4_ | (uint)!bVar11 * auVar193._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar200._16_4_ =
                 (float)((uint)bVar11 * auVar191._16_4_ | (uint)!bVar11 * auVar193._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar200._20_4_ =
                 (float)((uint)bVar11 * auVar191._20_4_ | (uint)!bVar11 * auVar193._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar200._24_4_ =
                 (float)((uint)bVar11 * auVar191._24_4_ | (uint)!bVar11 * auVar193._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar200._28_4_ =
                 (float)((uint)bVar11 * auVar191._28_4_ | (uint)!bVar11 * auVar193._28_4_);
            auVar176 = vfmsub231ps_fma(auVar194,auVar200,auVar296);
            auVar158 = vfnmsub231ps_fma(ZEXT1632(auVar176),auVar200,auVar329);
            auVar193 = ZEXT1632(auVar158);
            auVar176 = vfmadd213ps_fma(auVar305,auVar193,auVar309);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar313);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar317);
            auVar193 = ZEXT1632(auVar158);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar321);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),auVar193,auVar277);
            auVar176 = vfmadd213ps_fma(ZEXT1632(auVar176),
                                       ZEXT1632(CONCAT412(auVar158._12_4_ * auVar158._12_4_,
                                                          CONCAT48(auVar158._8_4_ * auVar158._8_4_,
                                                                   CONCAT44(auVar158._4_4_ *
                                                                            auVar158._4_4_,
                                                                            auVar158._0_4_ *
                                                                            auVar158._0_4_)))),
                                       auVar193);
            auVar244._0_4_ = auVar176._0_4_ + 1.0;
            auVar244._4_4_ = auVar176._4_4_ + 1.0;
            auVar244._8_4_ = auVar176._8_4_ + 1.0;
            auVar244._12_4_ = auVar176._12_4_ + 1.0;
            auVar244._16_4_ = 0x3f800000;
            auVar244._20_4_ = 0x3f800000;
            auVar244._24_4_ = 0x3f800000;
            auVar244._28_4_ = 0x3f800000;
            auVar264._0_4_ = (int)auVar200._0_4_;
            auVar264._4_4_ = (int)auVar200._4_4_;
            auVar264._8_4_ = (int)auVar200._8_4_;
            auVar264._12_4_ = (int)auVar200._12_4_;
            auVar264._16_4_ = (int)auVar200._16_4_;
            auVar264._20_4_ = (int)auVar200._20_4_;
            auVar264._24_4_ = (int)auVar200._24_4_;
            auVar264._28_4_ = (int)auVar200._28_4_;
            auVar193 = vpslld_avx2(auVar264,0x17);
            auVar193 = vpaddd_avx2(auVar325,auVar193);
            auVar176 = vfmadd213ps_fma(auVar193,auVar244,auVar291);
            auVar193 = vrcpps_avx(ZEXT1632(auVar176));
            auVar176 = vfmsub213ps_fma(ZEXT1632(auVar176),auVar193,auVar291);
            auVar176 = vfnmadd132ps_fma(ZEXT1632(auVar176),auVar193,auVar193);
            auVar193 = vfnmadd213ps_avx512vl(ZEXT1632(auVar176),auVar190,auVar185);
            auVar195._4_4_ = auVar193._4_4_ * auVar228._4_4_;
            auVar195._0_4_ = auVar193._0_4_ * auVar228._0_4_;
            auVar195._8_4_ = auVar193._8_4_ * auVar228._8_4_;
            auVar195._12_4_ = auVar193._12_4_ * auVar228._12_4_;
            auVar195._16_4_ = auVar193._16_4_ * auVar228._16_4_;
            auVar195._20_4_ = auVar193._20_4_ * auVar228._20_4_;
            auVar195._24_4_ = auVar193._24_4_ * auVar228._24_4_;
            auVar195._28_4_ = auVar200._28_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar247._4_4_ = uVar1;
            auVar247._0_4_ = uVar1;
            auVar247._8_4_ = uVar1;
            auVar247._12_4_ = uVar1;
            auVar247._16_4_ = uVar1;
            auVar247._20_4_ = uVar1;
            auVar247._24_4_ = uVar1;
            auVar247._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar73._4_4_ = uVar1;
            auVar73._0_4_ = uVar1;
            auVar73._8_4_ = uVar1;
            auVar73._12_4_ = uVar1;
            auVar73._16_4_ = uVar1;
            auVar73._20_4_ = uVar1;
            auVar73._24_4_ = uVar1;
            auVar73._28_4_ = uVar1;
            auVar193 = vfmadd213ps_avx512vl(auVar247,auVar228,auVar73);
            auVar193 = vmaxps_avx512vl(auVar193,ZEXT1632(auVar157));
            auVar193 = vminps_avx(auVar193,auVar291);
            auVar119._4_4_ = auVar193._4_4_ * auVar228._4_4_;
            auVar119._0_4_ = auVar193._0_4_ * auVar228._0_4_;
            auVar119._8_4_ = auVar193._8_4_ * auVar228._8_4_;
            auVar119._12_4_ = auVar193._12_4_ * auVar228._12_4_;
            auVar119._16_4_ = auVar193._16_4_ * auVar228._16_4_;
            auVar119._20_4_ = auVar193._20_4_ * auVar228._20_4_;
            auVar119._24_4_ = auVar193._24_4_ * auVar228._24_4_;
            auVar119._28_4_ = auVar195._28_4_;
            auVar195 = auVar119;
          }
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar136 * 0x20) = auVar195;
      }
    }
    else if (iVar149 == 0x10) {
      auVar207 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar208 = vxorps_avx512dq(auVar207,(undefined1  [64])_ps512_cephes_log_q2);
      auVar209 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar207);
      auVar210 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      uVar153 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar153 = 0;
      }
      auVar211 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar207);
      auVar212 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar157 = vxorps_avx512vl(auVar157,auVar157);
      auVar336 = ZEXT1664(auVar157);
      auVar213 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      for (uVar136 = 0; uVar136 != uVar153; uVar136 = uVar136 + 1) {
        auVar157 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar335 = ZEXT1664(auVar157);
        auVar157 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar334 = ZEXT1664(auVar157);
        if (lVar8 != 0) {
          auVar334 = *(undefined1 (*) [64])(lVar8 + uVar136 * 0x40);
        }
        pvVar9 = (this->weight_data_tm).data;
        sVar10 = (this->weight_data_tm).elemsize;
        lVar138 = (long)(this->weight_data_tm).w;
        pauVar137 = (undefined1 (*) [32])(uVar136 * lVar138 * sVar10 + (long)pvVar9);
        lVar142 = 0;
        lVar145 = 0;
        iVar149 = 0;
        auVar157 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar157);
        auVar157 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar157);
        auVar157 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar157);
        auVar157 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar157);
        auVar157 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar157);
        auVar157 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar157);
        pauVar146 = local_338;
        for (; iVar149 + 7 < iVar141; iVar149 = iVar149 + 8) {
          auVar214 = vcvtph2ps_avx512f(*pauVar137);
          auVar215 = vcvtph2ps_avx512f(pauVar137[1]);
          auVar216 = vcvtph2ps_avx512f(pauVar137[2]);
          auVar217 = vcvtph2ps_avx512f(pauVar137[3]);
          uVar1 = *(undefined4 *)*pauVar146;
          auVar218._4_4_ = uVar1;
          auVar218._0_4_ = uVar1;
          auVar218._8_4_ = uVar1;
          auVar218._12_4_ = uVar1;
          auVar218._16_4_ = uVar1;
          auVar218._20_4_ = uVar1;
          auVar218._24_4_ = uVar1;
          auVar218._28_4_ = uVar1;
          auVar218._32_4_ = uVar1;
          auVar218._36_4_ = uVar1;
          auVar218._40_4_ = uVar1;
          auVar218._44_4_ = uVar1;
          auVar218._48_4_ = uVar1;
          auVar218._52_4_ = uVar1;
          auVar218._56_4_ = uVar1;
          auVar218._60_4_ = uVar1;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar214,auVar218);
          uVar1 = *(undefined4 *)(*pauVar146 + 4);
          auVar214._4_4_ = uVar1;
          auVar214._0_4_ = uVar1;
          auVar214._8_4_ = uVar1;
          auVar214._12_4_ = uVar1;
          auVar214._16_4_ = uVar1;
          auVar214._20_4_ = uVar1;
          auVar214._24_4_ = uVar1;
          auVar214._28_4_ = uVar1;
          auVar214._32_4_ = uVar1;
          auVar214._36_4_ = uVar1;
          auVar214._40_4_ = uVar1;
          auVar214._44_4_ = uVar1;
          auVar214._48_4_ = uVar1;
          auVar214._52_4_ = uVar1;
          auVar214._56_4_ = uVar1;
          auVar214._60_4_ = uVar1;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar215,auVar214);
          uVar1 = *(undefined4 *)(*pauVar146 + 8);
          auVar215._4_4_ = uVar1;
          auVar215._0_4_ = uVar1;
          auVar215._8_4_ = uVar1;
          auVar215._12_4_ = uVar1;
          auVar215._16_4_ = uVar1;
          auVar215._20_4_ = uVar1;
          auVar215._24_4_ = uVar1;
          auVar215._28_4_ = uVar1;
          auVar215._32_4_ = uVar1;
          auVar215._36_4_ = uVar1;
          auVar215._40_4_ = uVar1;
          auVar215._44_4_ = uVar1;
          auVar215._48_4_ = uVar1;
          auVar215._52_4_ = uVar1;
          auVar215._56_4_ = uVar1;
          auVar215._60_4_ = uVar1;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar216,auVar215);
          uVar1 = *(undefined4 *)(*pauVar146 + 0xc);
          auVar216._4_4_ = uVar1;
          auVar216._0_4_ = uVar1;
          auVar216._8_4_ = uVar1;
          auVar216._12_4_ = uVar1;
          auVar216._16_4_ = uVar1;
          auVar216._20_4_ = uVar1;
          auVar216._24_4_ = uVar1;
          auVar216._28_4_ = uVar1;
          auVar216._32_4_ = uVar1;
          auVar216._36_4_ = uVar1;
          auVar216._40_4_ = uVar1;
          auVar216._44_4_ = uVar1;
          auVar216._48_4_ = uVar1;
          auVar216._52_4_ = uVar1;
          auVar216._56_4_ = uVar1;
          auVar216._60_4_ = uVar1;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar217,auVar216);
          auVar218 = vcvtph2ps_avx512f(pauVar137[4]);
          auVar214 = vcvtph2ps_avx512f(pauVar137[5]);
          auVar215 = vcvtph2ps_avx512f(pauVar137[6]);
          auVar216 = vcvtph2ps_avx512f(pauVar137[7]);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x10);
          auVar217._4_4_ = uVar1;
          auVar217._0_4_ = uVar1;
          auVar217._8_4_ = uVar1;
          auVar217._12_4_ = uVar1;
          auVar217._16_4_ = uVar1;
          auVar217._20_4_ = uVar1;
          auVar217._24_4_ = uVar1;
          auVar217._28_4_ = uVar1;
          auVar217._32_4_ = uVar1;
          auVar217._36_4_ = uVar1;
          auVar217._40_4_ = uVar1;
          auVar217._44_4_ = uVar1;
          auVar217._48_4_ = uVar1;
          auVar217._52_4_ = uVar1;
          auVar217._56_4_ = uVar1;
          auVar217._60_4_ = uVar1;
          in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar218,auVar217);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x14);
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          auVar108._32_4_ = uVar1;
          auVar108._36_4_ = uVar1;
          auVar108._40_4_ = uVar1;
          auVar108._44_4_ = uVar1;
          auVar108._48_4_ = uVar1;
          auVar108._52_4_ = uVar1;
          auVar108._56_4_ = uVar1;
          auVar108._60_4_ = uVar1;
          in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar214,auVar108);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x18);
          auVar109._4_4_ = uVar1;
          auVar109._0_4_ = uVar1;
          auVar109._8_4_ = uVar1;
          auVar109._12_4_ = uVar1;
          auVar109._16_4_ = uVar1;
          auVar109._20_4_ = uVar1;
          auVar109._24_4_ = uVar1;
          auVar109._28_4_ = uVar1;
          auVar109._32_4_ = uVar1;
          auVar109._36_4_ = uVar1;
          auVar109._40_4_ = uVar1;
          auVar109._44_4_ = uVar1;
          auVar109._48_4_ = uVar1;
          auVar109._52_4_ = uVar1;
          auVar109._56_4_ = uVar1;
          auVar109._60_4_ = uVar1;
          in_ZMM18 = vfmadd231ps_avx512f(in_ZMM18,auVar215,auVar109);
          uVar1 = *(undefined4 *)(*pauVar146 + 0x1c);
          auVar110._4_4_ = uVar1;
          auVar110._0_4_ = uVar1;
          auVar110._8_4_ = uVar1;
          auVar110._12_4_ = uVar1;
          auVar110._16_4_ = uVar1;
          auVar110._20_4_ = uVar1;
          auVar110._24_4_ = uVar1;
          auVar110._28_4_ = uVar1;
          auVar110._32_4_ = uVar1;
          auVar110._36_4_ = uVar1;
          auVar110._40_4_ = uVar1;
          auVar110._44_4_ = uVar1;
          auVar110._48_4_ = uVar1;
          auVar110._52_4_ = uVar1;
          auVar110._56_4_ = uVar1;
          auVar110._60_4_ = uVar1;
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar216,auVar110);
          pauVar146 = pauVar146 + 1;
          pauVar137 = pauVar137 + 8;
          lVar145 = lVar145 + 0x20;
          lVar142 = lVar142 + 8;
        }
        lVar138 = sVar10 * uVar136 * lVar138;
        for (; iVar149 + 3 < iVar141; iVar149 = iVar149 + 4) {
          auVar218 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pvVar9 + lVar145 * 8 + lVar138))
          ;
          auVar214 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar145 * 8 + lVar138 + 0x20));
          auVar215 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar145 * 8 + lVar138 + 0x40));
          auVar216 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar145 * 8 + lVar138 + 0x60));
          uVar1 = *(undefined4 *)(*local_338 + lVar145);
          auVar111._4_4_ = uVar1;
          auVar111._0_4_ = uVar1;
          auVar111._8_4_ = uVar1;
          auVar111._12_4_ = uVar1;
          auVar111._16_4_ = uVar1;
          auVar111._20_4_ = uVar1;
          auVar111._24_4_ = uVar1;
          auVar111._28_4_ = uVar1;
          auVar111._32_4_ = uVar1;
          auVar111._36_4_ = uVar1;
          auVar111._40_4_ = uVar1;
          auVar111._44_4_ = uVar1;
          auVar111._48_4_ = uVar1;
          auVar111._52_4_ = uVar1;
          auVar111._56_4_ = uVar1;
          auVar111._60_4_ = uVar1;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar218,auVar111);
          uVar1 = *(undefined4 *)(*local_338 + lVar145 + 4);
          auVar112._4_4_ = uVar1;
          auVar112._0_4_ = uVar1;
          auVar112._8_4_ = uVar1;
          auVar112._12_4_ = uVar1;
          auVar112._16_4_ = uVar1;
          auVar112._20_4_ = uVar1;
          auVar112._24_4_ = uVar1;
          auVar112._28_4_ = uVar1;
          auVar112._32_4_ = uVar1;
          auVar112._36_4_ = uVar1;
          auVar112._40_4_ = uVar1;
          auVar112._44_4_ = uVar1;
          auVar112._48_4_ = uVar1;
          auVar112._52_4_ = uVar1;
          auVar112._56_4_ = uVar1;
          auVar112._60_4_ = uVar1;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar214,auVar112);
          uVar1 = *(undefined4 *)(*local_338 + lVar145 + 8);
          auVar113._4_4_ = uVar1;
          auVar113._0_4_ = uVar1;
          auVar113._8_4_ = uVar1;
          auVar113._12_4_ = uVar1;
          auVar113._16_4_ = uVar1;
          auVar113._20_4_ = uVar1;
          auVar113._24_4_ = uVar1;
          auVar113._28_4_ = uVar1;
          auVar113._32_4_ = uVar1;
          auVar113._36_4_ = uVar1;
          auVar113._40_4_ = uVar1;
          auVar113._44_4_ = uVar1;
          auVar113._48_4_ = uVar1;
          auVar113._52_4_ = uVar1;
          auVar113._56_4_ = uVar1;
          auVar113._60_4_ = uVar1;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar215,auVar113);
          uVar1 = *(undefined4 *)(*local_338 + lVar145 + 0xc);
          auVar114._4_4_ = uVar1;
          auVar114._0_4_ = uVar1;
          auVar114._8_4_ = uVar1;
          auVar114._12_4_ = uVar1;
          auVar114._16_4_ = uVar1;
          auVar114._20_4_ = uVar1;
          auVar114._24_4_ = uVar1;
          auVar114._28_4_ = uVar1;
          auVar114._32_4_ = uVar1;
          auVar114._36_4_ = uVar1;
          auVar114._40_4_ = uVar1;
          auVar114._44_4_ = uVar1;
          auVar114._48_4_ = uVar1;
          auVar114._52_4_ = uVar1;
          auVar114._56_4_ = uVar1;
          auVar114._60_4_ = uVar1;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar216,auVar114);
          pauVar137 = pauVar137 + 4;
          lVar145 = lVar145 + 0x10;
          lVar142 = lVar142 + 4;
        }
        for (; (int)lVar142 < iVar141; lVar142 = lVar142 + 1) {
          auVar183 = vlddqu_avx(*pauVar137);
          auVar218 = vcvtph2ps_avx512f(auVar183);
          uVar1 = *(undefined4 *)(*local_338 + lVar142 * 4);
          auVar115._4_4_ = uVar1;
          auVar115._0_4_ = uVar1;
          auVar115._8_4_ = uVar1;
          auVar115._12_4_ = uVar1;
          auVar115._16_4_ = uVar1;
          auVar115._20_4_ = uVar1;
          auVar115._24_4_ = uVar1;
          auVar115._28_4_ = uVar1;
          auVar115._32_4_ = uVar1;
          auVar115._36_4_ = uVar1;
          auVar115._40_4_ = uVar1;
          auVar115._44_4_ = uVar1;
          auVar115._48_4_ = uVar1;
          auVar115._52_4_ = uVar1;
          auVar115._56_4_ = uVar1;
          auVar115._60_4_ = uVar1;
          auVar334 = vfmadd231ps_avx512f(auVar334,auVar218,auVar115);
          pauVar137 = pauVar137 + 1;
        }
        auVar335 = vaddps_avx512f(in_ZMM18,auVar335);
        auVar218 = vaddps_avx512f(in_ZMM19,in_ZMM21);
        auVar335 = vaddps_avx512f(auVar335,auVar218);
        auVar218 = vaddps_avx512f(in_ZMM20,in_ZMM22);
        in_ZMM17 = vaddps_avx512f(auVar218,in_ZMM23);
        auVar335 = vaddps_avx512f(auVar335,in_ZMM17);
        auVar334 = vaddps_avx512f(auVar335,auVar334);
        in_ZMM16 = auVar334;
        switch(iVar134) {
        case 1:
          in_ZMM16 = vmaxps_avx512f(auVar334,auVar336);
          break;
        case 2:
          uVar13 = vcmpps_avx512f(auVar334,auVar336,1);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar117._4_4_ = uVar1;
          auVar117._0_4_ = uVar1;
          auVar117._8_4_ = uVar1;
          auVar117._12_4_ = uVar1;
          auVar117._16_4_ = uVar1;
          auVar117._20_4_ = uVar1;
          auVar117._24_4_ = uVar1;
          auVar117._28_4_ = uVar1;
          auVar117._32_4_ = uVar1;
          auVar117._36_4_ = uVar1;
          auVar117._40_4_ = uVar1;
          auVar117._44_4_ = uVar1;
          auVar117._48_4_ = uVar1;
          auVar117._52_4_ = uVar1;
          auVar117._56_4_ = uVar1;
          auVar117._60_4_ = uVar1;
          auVar335 = vmulps_avx512f(auVar334,auVar117);
          bVar11 = (bool)((byte)uVar13 & 1);
          in_ZMM16._0_4_ = (uint)bVar11 * auVar335._0_4_ | (uint)!bVar11 * auVar334._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          in_ZMM16._4_4_ = (uint)bVar11 * auVar335._4_4_ | (uint)!bVar11 * auVar334._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          in_ZMM16._8_4_ = (uint)bVar11 * auVar335._8_4_ | (uint)!bVar11 * auVar334._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          in_ZMM16._12_4_ = (uint)bVar11 * auVar335._12_4_ | (uint)!bVar11 * auVar334._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          in_ZMM16._16_4_ = (uint)bVar11 * auVar335._16_4_ | (uint)!bVar11 * auVar334._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          in_ZMM16._20_4_ = (uint)bVar11 * auVar335._20_4_ | (uint)!bVar11 * auVar334._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          in_ZMM16._24_4_ = (uint)bVar11 * auVar335._24_4_ | (uint)!bVar11 * auVar334._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          in_ZMM16._28_4_ = (uint)bVar11 * auVar335._28_4_ | (uint)!bVar11 * auVar334._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          in_ZMM16._32_4_ = (uint)bVar11 * auVar335._32_4_ | (uint)!bVar11 * auVar334._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          in_ZMM16._36_4_ = (uint)bVar11 * auVar335._36_4_ | (uint)!bVar11 * auVar334._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          in_ZMM16._40_4_ = (uint)bVar11 * auVar335._40_4_ | (uint)!bVar11 * auVar334._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          in_ZMM16._44_4_ = (uint)bVar11 * auVar335._44_4_ | (uint)!bVar11 * auVar334._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          in_ZMM16._48_4_ = (uint)bVar11 * auVar335._48_4_ | (uint)!bVar11 * auVar334._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          in_ZMM16._52_4_ = (uint)bVar11 * auVar335._52_4_ | (uint)!bVar11 * auVar334._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          in_ZMM16._56_4_ = (uint)bVar11 * auVar335._56_4_ | (uint)!bVar11 * auVar334._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          in_ZMM16._60_4_ = (uint)bVar11 * auVar335._60_4_ | (uint)!bVar11 * auVar334._60_4_;
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar116._4_4_ = uVar1;
          auVar116._0_4_ = uVar1;
          auVar116._8_4_ = uVar1;
          auVar116._12_4_ = uVar1;
          auVar116._16_4_ = uVar1;
          auVar116._20_4_ = uVar1;
          auVar116._24_4_ = uVar1;
          auVar116._28_4_ = uVar1;
          auVar116._32_4_ = uVar1;
          auVar116._36_4_ = uVar1;
          auVar116._40_4_ = uVar1;
          auVar116._44_4_ = uVar1;
          auVar116._48_4_ = uVar1;
          auVar116._52_4_ = uVar1;
          auVar116._56_4_ = uVar1;
          auVar116._60_4_ = uVar1;
          auVar335 = vmaxps_avx512f(auVar334,auVar116);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar334._4_4_ = uVar1;
          auVar334._0_4_ = uVar1;
          auVar334._8_4_ = uVar1;
          auVar334._12_4_ = uVar1;
          auVar334._16_4_ = uVar1;
          auVar334._20_4_ = uVar1;
          auVar334._24_4_ = uVar1;
          auVar334._28_4_ = uVar1;
          auVar334._32_4_ = uVar1;
          auVar334._36_4_ = uVar1;
          auVar334._40_4_ = uVar1;
          auVar334._44_4_ = uVar1;
          auVar334._48_4_ = uVar1;
          auVar334._52_4_ = uVar1;
          auVar334._56_4_ = uVar1;
          auVar334._60_4_ = uVar1;
          in_ZMM16 = vminps_avx512f(auVar335,auVar334);
          break;
        case 4:
          auVar334 = vxorps_avx512dq(auVar334,auVar207);
          auVar334 = vminps_avx512f(auVar334,(undefined1  [64])afVar124);
          auVar334 = vmaxps_avx512f(auVar334,(undefined1  [64])afVar125);
          auVar335 = vfmadd213ps_avx512f((undefined1  [64])afVar126,auVar334,
                                         (undefined1  [64])afVar132);
          auVar218 = vrndscaleps_avx512f(auVar335,1);
          uVar13 = vcmpps_avx512f(auVar335,auVar218,1);
          auVar335 = vsubps_avx512f(auVar218,(undefined1  [64])afVar123);
          bVar11 = (bool)((byte)uVar13 & 1);
          in_ZMM17._0_4_ = (uint)bVar11 * auVar335._0_4_ | (uint)!bVar11 * auVar218._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          in_ZMM17._4_4_ = (uint)bVar11 * auVar335._4_4_ | (uint)!bVar11 * auVar218._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          in_ZMM17._8_4_ = (uint)bVar11 * auVar335._8_4_ | (uint)!bVar11 * auVar218._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          in_ZMM17._12_4_ = (uint)bVar11 * auVar335._12_4_ | (uint)!bVar11 * auVar218._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          in_ZMM17._16_4_ = (uint)bVar11 * auVar335._16_4_ | (uint)!bVar11 * auVar218._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          in_ZMM17._20_4_ = (uint)bVar11 * auVar335._20_4_ | (uint)!bVar11 * auVar218._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          in_ZMM17._24_4_ = (uint)bVar11 * auVar335._24_4_ | (uint)!bVar11 * auVar218._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          in_ZMM17._28_4_ = (uint)bVar11 * auVar335._28_4_ | (uint)!bVar11 * auVar218._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          in_ZMM17._32_4_ = (uint)bVar11 * auVar335._32_4_ | (uint)!bVar11 * auVar218._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          in_ZMM17._36_4_ = (uint)bVar11 * auVar335._36_4_ | (uint)!bVar11 * auVar218._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          in_ZMM17._40_4_ = (uint)bVar11 * auVar335._40_4_ | (uint)!bVar11 * auVar218._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          in_ZMM17._44_4_ = (uint)bVar11 * auVar335._44_4_ | (uint)!bVar11 * auVar218._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          in_ZMM17._48_4_ = (uint)bVar11 * auVar335._48_4_ | (uint)!bVar11 * auVar218._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          in_ZMM17._52_4_ = (uint)bVar11 * auVar335._52_4_ | (uint)!bVar11 * auVar218._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          in_ZMM17._56_4_ = (uint)bVar11 * auVar335._56_4_ | (uint)!bVar11 * auVar218._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          in_ZMM17._60_4_ = (uint)bVar11 * auVar335._60_4_ | (uint)!bVar11 * auVar218._60_4_;
          auVar334 = vfmadd231ps_avx512f(auVar334,in_ZMM17,auVar208);
          auVar334 = vfmadd231ps_avx512f(auVar334,in_ZMM17,auVar209);
          auVar335 = vmulps_avx512f(auVar334,auVar334);
          auVar218 = vfmadd213ps_avx512f(auVar334,(undefined1  [64])afVar127,
                                         (undefined1  [64])afVar128);
          auVar218 = vfmadd213ps_avx512f(auVar218,auVar334,(undefined1  [64])afVar129);
          auVar218 = vfmadd213ps_avx512f(auVar218,auVar334,(undefined1  [64])afVar130);
          auVar218 = vfmadd213ps_avx512f(auVar218,auVar334,(undefined1  [64])afVar131);
          auVar218 = vfmadd213ps_avx512f(auVar218,auVar334,(undefined1  [64])afVar132);
          in_ZMM18 = vfmadd213ps_avx512f(auVar218,auVar335,auVar334);
          auVar334 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar123);
          auVar335 = vcvttps2dq_avx512f(in_ZMM17);
          auVar335 = vpaddd_avx512f(auVar335,auVar210);
          auVar335 = vpslld_avx512f(auVar335,0x17);
          auVar334 = vfmadd213ps_avx512f(auVar335,auVar334,auVar212);
          auVar335 = vrcp14ps_avx512f(auVar334);
          auVar334 = vfmsub213ps_avx512f(auVar334,auVar335,auVar212);
          in_ZMM16 = vfnmadd132ps_avx512vl(auVar334,auVar335,auVar335);
          break;
        case 5:
          auVar335 = vminps_avx512f(auVar334,(undefined1  [64])afVar124);
          auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar125);
          auVar218 = vfmadd213ps_avx512f((undefined1  [64])afVar126,auVar335,
                                         (undefined1  [64])afVar132);
          auVar214 = vrndscaleps_avx512f(auVar218,1);
          uVar13 = vcmpps_avx512f(auVar218,auVar214,1);
          auVar218 = vsubps_avx512f(auVar214,(undefined1  [64])afVar123);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar219._0_4_ = (uint)bVar11 * auVar218._0_4_ | (uint)!bVar11 * auVar214._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar219._4_4_ = (uint)bVar11 * auVar218._4_4_ | (uint)!bVar11 * auVar214._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar219._8_4_ = (uint)bVar11 * auVar218._8_4_ | (uint)!bVar11 * auVar214._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar219._12_4_ = (uint)bVar11 * auVar218._12_4_ | (uint)!bVar11 * auVar214._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar219._16_4_ = (uint)bVar11 * auVar218._16_4_ | (uint)!bVar11 * auVar214._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar219._20_4_ = (uint)bVar11 * auVar218._20_4_ | (uint)!bVar11 * auVar214._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar219._24_4_ = (uint)bVar11 * auVar218._24_4_ | (uint)!bVar11 * auVar214._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar219._28_4_ = (uint)bVar11 * auVar218._28_4_ | (uint)!bVar11 * auVar214._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          auVar219._32_4_ = (uint)bVar11 * auVar218._32_4_ | (uint)!bVar11 * auVar214._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          auVar219._36_4_ = (uint)bVar11 * auVar218._36_4_ | (uint)!bVar11 * auVar214._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          auVar219._40_4_ = (uint)bVar11 * auVar218._40_4_ | (uint)!bVar11 * auVar214._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          auVar219._44_4_ = (uint)bVar11 * auVar218._44_4_ | (uint)!bVar11 * auVar214._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          auVar219._48_4_ = (uint)bVar11 * auVar218._48_4_ | (uint)!bVar11 * auVar214._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          auVar219._52_4_ = (uint)bVar11 * auVar218._52_4_ | (uint)!bVar11 * auVar214._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          auVar219._56_4_ = (uint)bVar11 * auVar218._56_4_ | (uint)!bVar11 * auVar214._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          auVar219._60_4_ = (uint)bVar11 * auVar218._60_4_ | (uint)!bVar11 * auVar214._60_4_;
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar219,auVar208);
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar219,auVar209);
          auVar218 = vmulps_avx512f(auVar335,auVar335);
          auVar214 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar127,
                                         (undefined1  [64])afVar128);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar129);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar130);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar131);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar132);
          auVar335 = vfmadd213ps_avx512f(auVar214,auVar218,auVar335);
          auVar335 = vaddps_avx512f(auVar335,(undefined1  [64])afVar123);
          auVar218 = vcvttps2dq_avx512f(auVar219);
          auVar218 = vpaddd_avx512f(auVar218,auVar210);
          auVar218 = vpslld_avx512f(auVar218,0x17);
          auVar335 = vfmadd213ps_avx512f(auVar218,auVar335,auVar212);
          auVar218 = vmaxps_avx512f(auVar335,(undefined1  [64])_ps512_min_norm_pos);
          auVar214 = vpsrld_avx512f(auVar218,0x17);
          auVar218 = vpternlogd_avx512f(auVar218,(undefined1  [64])afVar132,
                                        (undefined1  [64])_ps512_inv_mant_mask,0xec);
          uVar13 = vcmpps_avx512f(auVar218,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar215 = vsubps_avx512f(auVar218,(undefined1  [64])afVar123);
          auVar218 = vaddps_avx512f(auVar215,auVar218);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar220._0_4_ = (uint)bVar11 * auVar218._0_4_ | (uint)!bVar11 * auVar215._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar220._4_4_ = (uint)bVar11 * auVar218._4_4_ | (uint)!bVar11 * auVar215._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar220._8_4_ = (uint)bVar11 * auVar218._8_4_ | (uint)!bVar11 * auVar215._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar220._12_4_ = (uint)bVar11 * auVar218._12_4_ | (uint)!bVar11 * auVar215._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar220._16_4_ = (uint)bVar11 * auVar218._16_4_ | (uint)!bVar11 * auVar215._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar220._20_4_ = (uint)bVar11 * auVar218._20_4_ | (uint)!bVar11 * auVar215._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar220._24_4_ = (uint)bVar11 * auVar218._24_4_ | (uint)!bVar11 * auVar215._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar220._28_4_ = (uint)bVar11 * auVar218._28_4_ | (uint)!bVar11 * auVar215._28_4_;
          bVar12 = (byte)(uVar13 >> 8);
          bVar11 = (bool)(bVar12 & 1);
          auVar220._32_4_ = (uint)bVar11 * auVar218._32_4_ | (uint)!bVar11 * auVar215._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          auVar220._36_4_ = (uint)bVar11 * auVar218._36_4_ | (uint)!bVar11 * auVar215._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          auVar220._40_4_ = (uint)bVar11 * auVar218._40_4_ | (uint)!bVar11 * auVar215._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          auVar220._44_4_ = (uint)bVar11 * auVar218._44_4_ | (uint)!bVar11 * auVar215._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          auVar220._48_4_ = (uint)bVar11 * auVar218._48_4_ | (uint)!bVar11 * auVar215._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          auVar220._52_4_ = (uint)bVar11 * auVar218._52_4_ | (uint)!bVar11 * auVar215._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          auVar220._56_4_ = (uint)bVar11 * auVar218._56_4_ | (uint)!bVar11 * auVar215._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          auVar220._60_4_ = (uint)bVar11 * auVar218._60_4_ | (uint)!bVar11 * auVar215._60_4_;
          auVar218 = vmulps_avx512f(auVar220,auVar220);
          auVar215 = vfmadd132ps_avx512f(auVar220,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p2);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p3);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p4);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p5);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p6);
          auVar215 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p7);
          in_ZMM20 = vfmadd213ps_avx512f(auVar215,auVar220,(undefined1  [64])_ps512_cephes_log_p8);
          auVar215 = vmulps_avx512f(auVar218,auVar220);
          auVar215 = vfmadd213ps_avx512f(auVar215,in_ZMM20,auVar220);
          uVar14 = vcmpps_avx512f(auVar335,auVar336,2);
          auVar335 = vpsubd_avx512f(auVar214,auVar210);
          auVar335 = vcvtdq2ps_avx512f(auVar335);
          auVar214 = vaddps_avx512f(auVar335,(undefined1  [64])afVar123);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar221._0_4_ = (uint)bVar11 * auVar335._0_4_ | (uint)!bVar11 * auVar214._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar221._4_4_ = (uint)bVar11 * auVar335._4_4_ | (uint)!bVar11 * auVar214._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar221._8_4_ = (uint)bVar11 * auVar335._8_4_ | (uint)!bVar11 * auVar214._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar221._12_4_ = (uint)bVar11 * auVar335._12_4_ | (uint)!bVar11 * auVar214._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          auVar221._16_4_ = (uint)bVar11 * auVar335._16_4_ | (uint)!bVar11 * auVar214._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          auVar221._20_4_ = (uint)bVar11 * auVar335._20_4_ | (uint)!bVar11 * auVar214._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          auVar221._24_4_ = (uint)bVar11 * auVar335._24_4_ | (uint)!bVar11 * auVar214._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          auVar221._28_4_ = (uint)bVar11 * auVar335._28_4_ | (uint)!bVar11 * auVar214._28_4_;
          bVar11 = (bool)(bVar12 & 1);
          auVar221._32_4_ = (uint)bVar11 * auVar335._32_4_ | (uint)!bVar11 * auVar214._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          auVar221._36_4_ = (uint)bVar11 * auVar335._36_4_ | (uint)!bVar11 * auVar214._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          auVar221._40_4_ = (uint)bVar11 * auVar335._40_4_ | (uint)!bVar11 * auVar214._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          auVar221._44_4_ = (uint)bVar11 * auVar335._44_4_ | (uint)!bVar11 * auVar214._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          auVar221._48_4_ = (uint)bVar11 * auVar335._48_4_ | (uint)!bVar11 * auVar214._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          auVar221._52_4_ = (uint)bVar11 * auVar335._52_4_ | (uint)!bVar11 * auVar214._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          auVar221._56_4_ = (uint)bVar11 * auVar335._56_4_ | (uint)!bVar11 * auVar214._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          auVar221._60_4_ = (uint)bVar11 * auVar335._60_4_ | (uint)!bVar11 * auVar214._60_4_;
          auVar335 = vfmadd231ps_avx512f(auVar215,auVar221,(undefined1  [64])afVar133);
          auVar335 = vfmadd231ps_avx512f(auVar335,auVar211,auVar218);
          in_ZMM21 = vfmadd231ps_avx512f(auVar335,auVar221,(undefined1  [64])_ps512_cephes_log_q2);
          auVar335 = vmulps_avx512f(in_ZMM21,auVar213);
          auVar218 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar222._0_4_ = (uint)bVar11 * auVar218._0_4_ | (uint)!bVar11 * auVar335._0_4_;
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar222._4_4_ = (uint)bVar11 * auVar218._4_4_ | (uint)!bVar11 * auVar335._4_4_;
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar222._8_4_ = (uint)bVar11 * auVar218._8_4_ | (uint)!bVar11 * auVar335._8_4_;
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar222._12_4_ = (uint)bVar11 * auVar218._12_4_ | (uint)!bVar11 * auVar335._12_4_;
          bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar222._16_4_ = (uint)bVar11 * auVar218._16_4_ | (uint)!bVar11 * auVar335._16_4_;
          bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar222._20_4_ = (uint)bVar11 * auVar218._20_4_ | (uint)!bVar11 * auVar335._20_4_;
          bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar222._24_4_ = (uint)bVar11 * auVar218._24_4_ | (uint)!bVar11 * auVar335._24_4_;
          bVar11 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar222._28_4_ = (uint)bVar11 * auVar218._28_4_ | (uint)!bVar11 * auVar335._28_4_;
          bVar11 = (bool)((byte)(uVar14 >> 8) & 1);
          auVar222._32_4_ = (uint)bVar11 * auVar218._32_4_ | (uint)!bVar11 * auVar335._32_4_;
          bVar11 = (bool)((byte)(uVar14 >> 9) & 1);
          auVar222._36_4_ = (uint)bVar11 * auVar218._36_4_ | (uint)!bVar11 * auVar335._36_4_;
          bVar11 = (bool)((byte)(uVar14 >> 10) & 1);
          auVar222._40_4_ = (uint)bVar11 * auVar218._40_4_ | (uint)!bVar11 * auVar335._40_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xb) & 1);
          auVar222._44_4_ = (uint)bVar11 * auVar218._44_4_ | (uint)!bVar11 * auVar335._44_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xc) & 1);
          auVar222._48_4_ = (uint)bVar11 * auVar218._48_4_ | (uint)!bVar11 * auVar335._48_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xd) & 1);
          auVar222._52_4_ = (uint)bVar11 * auVar218._52_4_ | (uint)!bVar11 * auVar335._52_4_;
          bVar11 = (bool)((byte)(uVar14 >> 0xe) & 1);
          auVar222._56_4_ = (uint)bVar11 * auVar218._56_4_ | (uint)!bVar11 * auVar335._56_4_;
          bVar11 = SUB81(uVar14 >> 0xf,0);
          auVar222._60_4_ = (uint)bVar11 * auVar218._60_4_ | (uint)!bVar11 * auVar335._60_4_;
          auVar335 = vminps_avx512f(auVar222,(undefined1  [64])afVar124);
          auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar125);
          auVar218 = vfmadd213ps_avx512f((undefined1  [64])afVar126,auVar335,
                                         (undefined1  [64])afVar132);
          auVar214 = vrndscaleps_avx512f(auVar218,1);
          uVar13 = vcmpps_avx512f(auVar218,auVar214,1);
          auVar218 = vsubps_avx512f(auVar214,(undefined1  [64])afVar123);
          bVar11 = (bool)((byte)uVar13 & 1);
          in_ZMM18._0_4_ = (uint)bVar11 * auVar218._0_4_ | (uint)!bVar11 * auVar214._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          in_ZMM18._4_4_ = (uint)bVar11 * auVar218._4_4_ | (uint)!bVar11 * auVar214._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          in_ZMM18._8_4_ = (uint)bVar11 * auVar218._8_4_ | (uint)!bVar11 * auVar214._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          in_ZMM18._12_4_ = (uint)bVar11 * auVar218._12_4_ | (uint)!bVar11 * auVar214._12_4_;
          bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
          in_ZMM18._16_4_ = (uint)bVar11 * auVar218._16_4_ | (uint)!bVar11 * auVar214._16_4_;
          bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
          in_ZMM18._20_4_ = (uint)bVar11 * auVar218._20_4_ | (uint)!bVar11 * auVar214._20_4_;
          bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
          in_ZMM18._24_4_ = (uint)bVar11 * auVar218._24_4_ | (uint)!bVar11 * auVar214._24_4_;
          bVar11 = (bool)((byte)(uVar13 >> 7) & 1);
          in_ZMM18._28_4_ = (uint)bVar11 * auVar218._28_4_ | (uint)!bVar11 * auVar214._28_4_;
          bVar11 = (bool)((byte)(uVar13 >> 8) & 1);
          in_ZMM18._32_4_ = (uint)bVar11 * auVar218._32_4_ | (uint)!bVar11 * auVar214._32_4_;
          bVar11 = (bool)((byte)(uVar13 >> 9) & 1);
          in_ZMM18._36_4_ = (uint)bVar11 * auVar218._36_4_ | (uint)!bVar11 * auVar214._36_4_;
          bVar11 = (bool)((byte)(uVar13 >> 10) & 1);
          in_ZMM18._40_4_ = (uint)bVar11 * auVar218._40_4_ | (uint)!bVar11 * auVar214._40_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xb) & 1);
          in_ZMM18._44_4_ = (uint)bVar11 * auVar218._44_4_ | (uint)!bVar11 * auVar214._44_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xc) & 1);
          in_ZMM18._48_4_ = (uint)bVar11 * auVar218._48_4_ | (uint)!bVar11 * auVar214._48_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xd) & 1);
          in_ZMM18._52_4_ = (uint)bVar11 * auVar218._52_4_ | (uint)!bVar11 * auVar214._52_4_;
          bVar11 = (bool)((byte)(uVar13 >> 0xe) & 1);
          in_ZMM18._56_4_ = (uint)bVar11 * auVar218._56_4_ | (uint)!bVar11 * auVar214._56_4_;
          bVar11 = SUB81(uVar13 >> 0xf,0);
          in_ZMM18._60_4_ = (uint)bVar11 * auVar218._60_4_ | (uint)!bVar11 * auVar214._60_4_;
          auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM18,auVar208);
          auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM18,auVar209);
          auVar218 = vmulps_avx512f(auVar335,auVar335);
          auVar214 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar127,
                                         (undefined1  [64])afVar128);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar129);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar130);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar131);
          auVar214 = vfmadd213ps_avx512f(auVar214,auVar335,(undefined1  [64])afVar132);
          in_ZMM19 = vfmadd213ps_avx512f(auVar214,auVar218,auVar335);
          auVar335 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar123);
          auVar218 = vcvttps2dq_avx512f(in_ZMM18);
          auVar218 = vpaddd_avx512f(auVar218,auVar210);
          auVar218 = vpslld_avx512f(auVar218,0x17);
          auVar335 = vfmadd213ps_avx512f(auVar218,auVar335,auVar212);
          auVar218 = vrcp14ps_avx512f(auVar335);
          auVar335 = vfmsub213ps_avx512f(auVar335,auVar218,auVar212);
          auVar335 = vfnmadd132ps_avx512vl(auVar335,auVar218,auVar218);
          in_ZMM17 = vfnmsub213ps_avx512f(auVar335,auVar213,auVar212);
          in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar334);
          break;
        case 6:
          auVar218 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          uVar5 = (*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar335._4_4_ = uVar5;
          auVar335._0_4_ = uVar5;
          auVar335._8_4_ = uVar5;
          auVar335._12_4_ = uVar5;
          auVar335._16_4_ = uVar5;
          auVar335._20_4_ = uVar5;
          auVar335._24_4_ = uVar5;
          auVar335._28_4_ = uVar5;
          auVar335._32_4_ = uVar5;
          auVar335._36_4_ = uVar5;
          auVar335._40_4_ = uVar5;
          auVar335._44_4_ = uVar5;
          auVar335._48_4_ = uVar5;
          auVar335._52_4_ = uVar5;
          auVar335._56_4_ = uVar5;
          auVar335._60_4_ = uVar5;
          auVar335 = vfmadd213ps_avx512f(auVar218,auVar334,auVar335);
          auVar335 = vmaxps_avx512f(auVar335,auVar336);
          auVar335 = vminps_avx512f(auVar335,auVar212);
          in_ZMM16 = vmulps_avx512f(auVar335,auVar334);
        }
        *(undefined1 (*) [64])((long)top_blob->data + uVar136 * 0x40) = in_ZMM16;
      }
    }
    iVar134 = 0;
  }
  if (piStack_330 != (int *)0x0) {
    LOCK();
    *piStack_330 = *piStack_330 + -1;
    UNLOCK();
    if (*piStack_330 == 0) {
      if (local_318 == (Allocator *)0x0) {
        free(local_338);
      }
      else {
        (*local_318->_vptr_Allocator[3])();
      }
    }
  }
  return iVar134;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}